

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  short sVar26;
  undefined4 uVar27;
  undefined6 uVar28;
  short sVar29;
  undefined4 uVar30;
  undefined6 uVar31;
  undefined4 uVar32;
  undefined6 uVar33;
  undefined4 uVar34;
  undefined6 uVar35;
  undefined4 uVar36;
  undefined6 uVar37;
  undefined4 uVar38;
  undefined6 uVar39;
  undefined4 uVar40;
  undefined6 uVar41;
  undefined4 uVar42;
  undefined6 uVar43;
  undefined4 uVar44;
  undefined6 uVar45;
  undefined4 uVar46;
  undefined6 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  short sVar72;
  undefined4 uVar73;
  undefined6 uVar74;
  short sVar75;
  undefined4 uVar76;
  undefined6 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  long *plVar92;
  int *piVar93;
  long lVar94;
  long in_RSI;
  long in_RDI;
  short sVar95;
  short sVar109;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar96;
  short sVar110;
  undefined1 auVar107 [16];
  short sVar97;
  short sVar98;
  short sVar111;
  short sVar112;
  undefined1 auVar108 [16];
  __m128i _tmp3_2;
  __m128i _tmp2_2;
  __m128i _tmp1_2;
  __m128i _tmp0_2;
  __m128i _sh3;
  __m128i _sl3;
  __m128i _sh2;
  __m128i _sl2;
  __m128i _sh1;
  __m128i _sl1;
  __m128i _sh0;
  __m128i _sl0;
  __m128i _w3_1;
  __m128i _w2_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw23_1;
  __m128i _extw01_1;
  __m128i _w23_1;
  __m128i _w01_1;
  __m128i _val;
  int j_1;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn_1;
  char *kptr0_1;
  char *tmpptr_3;
  __m128i _tmp3_1;
  __m128i _tmp2_1;
  __m128i _tmp1_1;
  __m128i _tmp0_1;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh13;
  __m128i _sl13;
  __m128i _sh12;
  __m128i _sl12;
  __m128i _sh11;
  __m128i _sl11;
  __m128i _sh10;
  __m128i _sl10;
  __m128i _sh03;
  __m128i _sl03;
  __m128i _sh02;
  __m128i _sl02;
  __m128i _sh01;
  __m128i _sl01;
  __m128i _sh00;
  __m128i _sl00;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _extval01;
  __m128i _val01;
  int j;
  __m128i _sum13;
  __m128i _sum12;
  __m128i _sum11;
  __m128i _sum10;
  __m128i _sum03;
  __m128i _sum02;
  __m128i _sum01;
  __m128i _sum00;
  int nn;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr0;
  int p;
  int k_1;
  int64_t *img0_1;
  int q_1;
  int64_t *tmpptr_1;
  int i_1;
  __m128i _v;
  int k;
  int64_t *img0;
  int q;
  int64_t *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  int in_stack_ffffffffffffdd64;
  size_t in_stack_ffffffffffffdd68;
  int in_stack_ffffffffffffdd74;
  undefined8 in_stack_ffffffffffffdd78;
  int iVar113;
  Mat *in_stack_ffffffffffffdd80;
  Mat *in_stack_ffffffffffffdd88;
  undefined4 in_stack_ffffffffffffdd90;
  undefined4 in_stack_ffffffffffffdd94;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_1f48;
  undefined8 local_1f28;
  undefined8 local_1ec8;
  undefined8 local_1ea8;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1928;
  int local_180c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  Mat local_17b8;
  long *local_1770;
  Mat local_1768;
  long *local_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  long local_1538;
  long lStack_1530;
  long local_1528;
  long lStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  long local_14e8;
  long lStack_14e0;
  int local_14cc;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  int local_143c;
  Mat local_1438;
  long *local_13f0;
  Mat local_13e8;
  long *local_13a0;
  int local_1394;
  Mat local_1390;
  int *local_1348;
  int local_1340;
  int local_133c;
  Mat local_1338;
  long *local_12f0;
  int local_12e4;
  Mat local_12e0;
  long *local_1298;
  int local_128c;
  long local_1288;
  long lStack_1280;
  int local_126c;
  Mat local_1268;
  long *local_1220;
  int local_1214;
  Mat local_1210;
  long *local_11c8;
  int local_11bc;
  int local_11b8;
  int local_11b4;
  int local_11b0;
  Mat local_11a0;
  int local_1158;
  int local_1154;
  int local_1150;
  int local_114c;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  int local_1108;
  int iStack_1104;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  Mat *pMStack_10f0;
  int local_10e8;
  int iStack_10e4;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  int local_f88;
  int iStack_f84;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  int local_f68;
  int iStack_f64;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  int local_f48;
  int iStack_f44;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  int local_f28;
  int iStack_f24;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  long *local_d08;
  long *local_d00;
  long *local_cf8;
  long *local_cf0;
  long *local_ce8;
  long *local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  int *local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  int *local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  int *local_c80;
  long local_c78;
  long lStack_c70;
  long *local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  long local_a68;
  long lStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  long local_a48;
  long lStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  long local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  long local_a08;
  long lStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  long local_9e8;
  long lStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  long local_9c8;
  long lStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  long local_9a8;
  long lStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  long local_988;
  long lStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  long local_968;
  long lStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  long local_948;
  long lStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  long local_928;
  long lStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  Mat *local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Mat *local_d8;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  undefined8 local_98;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_2c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  long local_18;
  undefined8 uStack_10;
  long *local_8;
  
  local_114c = *(int *)(in_RDI + 0x2c);
  local_1150 = *(int *)(in_RDI + 0x30);
  local_1154 = *(int *)(in_RDI + 0x38);
  local_1158 = *(int *)(in_RSI + 0x38);
  Mat::Mat(&local_11a0);
  iVar113 = (int)((ulong)in_stack_ffffffffffffdd78 >> 0x20);
  if (local_114c < 2) {
    Mat::create(in_stack_ffffffffffffdd80,iVar113,(int)in_stack_ffffffffffffdd78,
                in_stack_ffffffffffffdd74,in_stack_ffffffffffffdd68,in_stack_ffffffffffffdd64,
                (Allocator *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  }
  else {
    Mat::create(in_stack_ffffffffffffdd80,iVar113,(int)in_stack_ffffffffffffdd78,
                in_stack_ffffffffffffdd74,in_stack_ffffffffffffdd68,in_stack_ffffffffffffdd64,
                (Allocator *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  }
  local_11b0 = 0;
  local_11b4 = local_114c >> 1;
  for (local_11b8 = 0; local_11b8 < local_11b4; local_11b8 = local_11b8 + 1) {
    local_11bc = local_11b0 + local_11b8 * 2;
    Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
    plVar92 = Mat::operator_cast_to_long_(&local_1210);
    Mat::~Mat((Mat *)0x1dbd2e);
    local_11c8 = plVar92;
    for (local_1214 = 0; local_1214 < local_1154; local_1214 = local_1214 + 1) {
      Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
      plVar92 = Mat::operator_cast_to_long_(&local_1268);
      lVar94 = (long)local_11bc;
      Mat::~Mat((Mat *)0x1dbdbe);
      local_1220 = plVar92 + lVar94;
      for (local_126c = 0; local_126c < local_1150; local_126c = local_126c + 1) {
        local_ce0 = local_1220;
        local_1288 = *local_1220;
        lStack_1280 = local_1220[1];
        local_c60 = local_11c8;
        *local_11c8 = local_1288;
        local_11c8[1] = lStack_1280;
        local_11c8 = local_11c8 + 2;
        local_1220 = local_1220 + local_114c;
        local_c78 = local_1288;
        lStack_c70 = lStack_1280;
      }
    }
  }
  local_128c = local_11b4 * 2 + local_11b0;
  local_11b0 = local_128c;
  for (; local_128c < local_114c; local_128c = local_128c + 1) {
    Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
    plVar92 = Mat::operator_cast_to_long_(&local_12e0);
    Mat::~Mat((Mat *)0x1dbfaf);
    local_1298 = plVar92;
    for (local_12e4 = 0; local_12e4 < local_1154; local_12e4 = local_12e4 + 1) {
      Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
      plVar92 = Mat::operator_cast_to_long_(&local_1338);
      lVar94 = (long)local_128c;
      Mat::~Mat((Mat *)0x1dc03f);
      local_12f0 = plVar92 + lVar94;
      for (local_133c = 0; local_133c < local_1150; local_133c = local_133c + 1) {
        *local_1298 = *local_12f0;
        local_1298 = local_1298 + 1;
        local_12f0 = local_12f0 + local_114c;
      }
    }
  }
  for (local_1340 = 0; local_1340 < local_1158; local_1340 = local_1340 + 1) {
    Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
    piVar93 = Mat::operator_cast_to_int_(&local_1390);
    Mat::~Mat((Mat *)0x1dc1a9);
    local_1348 = piVar93;
    for (local_1394 = 0; local_1394 + 1 < local_114c; local_1394 = local_1394 + 2) {
      Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
      plVar92 = (long *)Mat::operator_cast_to_signed_char_(&local_13e8);
      Mat::~Mat((Mat *)0x1dc226);
      local_13a0 = plVar92;
      Mat::channel(in_stack_ffffffffffffdd88,(int)((ulong)in_stack_ffffffffffffdd80 >> 0x20));
      plVar92 = (long *)Mat::operator_cast_to_signed_char_(&local_1438);
      Mat::~Mat((Mat *)0x1dc27e);
      local_143c = local_1154 * local_1150;
      local_b48 = 0;
      uStack_b40 = 0;
      local_1458 = 0;
      uStack_1450 = 0;
      local_b58 = 0;
      uStack_b50 = 0;
      local_1468 = 0;
      uStack_1460 = 0;
      local_b68 = 0;
      uStack_b60 = 0;
      local_1478 = 0;
      uStack_1470 = 0;
      local_b78 = 0;
      uStack_b70 = 0;
      local_1488 = 0;
      uStack_1480 = 0;
      local_b88 = 0;
      uStack_b80 = 0;
      local_1498 = 0;
      uStack_1490 = 0;
      local_b98 = 0;
      uStack_b90 = 0;
      local_14a8 = 0;
      uStack_14a0 = 0;
      local_ba8 = 0;
      uStack_ba0 = 0;
      local_14b8 = 0;
      uStack_14b0 = 0;
      local_bb8 = 0;
      uStack_bb0 = 0;
      local_14c8 = 0;
      uStack_14c0 = 0;
      local_14cc = 0;
      local_13f0 = plVar92;
      while( true ) {
        uVar16 = uStack_d10;
        uVar15 = local_d18;
        uVar14 = uStack_d30;
        uVar13 = local_d38;
        uVar12 = uStack_d50;
        uVar11 = local_d58;
        uVar10 = uStack_d70;
        uVar9 = local_d78;
        uVar8 = uStack_e10;
        uVar7 = local_e18;
        uVar6 = uStack_e30;
        uVar5 = local_e38;
        uVar4 = uStack_e50;
        uVar3 = local_e58;
        uVar2 = uStack_e70;
        uVar1 = local_e78;
        local_d18._0_4_ = (int)local_1458;
        local_d18._4_4_ = (int)((ulong)local_1458 >> 0x20);
        uStack_d10._0_4_ = (int)uStack_1450;
        uStack_d10._4_4_ = (int)((ulong)uStack_1450 >> 0x20);
        local_d38._0_4_ = (int)local_1468;
        local_d38._4_4_ = (int)((ulong)local_1468 >> 0x20);
        uStack_d30._0_4_ = (int)uStack_1460;
        uStack_d30._4_4_ = (int)((ulong)uStack_1460 >> 0x20);
        local_d58._0_4_ = (int)local_1478;
        local_d58._4_4_ = (int)((ulong)local_1478 >> 0x20);
        uStack_d50._0_4_ = (int)uStack_1470;
        uStack_d50._4_4_ = (int)((ulong)uStack_1470 >> 0x20);
        local_d78._0_4_ = (int)local_1488;
        local_d78._4_4_ = (int)((ulong)local_1488 >> 0x20);
        uStack_d70._0_4_ = (int)uStack_1480;
        uStack_d70._4_4_ = (int)((ulong)uStack_1480 >> 0x20);
        local_e18._0_4_ = (int)local_1498;
        local_e18._4_4_ = (int)((ulong)local_1498 >> 0x20);
        uStack_e10._0_4_ = (int)uStack_1490;
        uStack_e10._4_4_ = (int)((ulong)uStack_1490 >> 0x20);
        local_e38._0_4_ = (int)local_14a8;
        local_e38._4_4_ = (int)((ulong)local_14a8 >> 0x20);
        uStack_e30._0_4_ = (int)uStack_14a0;
        uStack_e30._4_4_ = (int)((ulong)uStack_14a0 >> 0x20);
        local_e58._0_4_ = (int)local_14b8;
        local_e58._4_4_ = (int)((ulong)local_14b8 >> 0x20);
        uStack_e50._0_4_ = (int)uStack_14b0;
        uStack_e50._4_4_ = (int)((ulong)uStack_14b0 >> 0x20);
        local_e78._0_4_ = (int)local_14c8;
        local_e78._4_4_ = (int)((ulong)local_14c8 >> 0x20);
        uStack_e70._0_4_ = (int)uStack_14c0;
        uStack_e70._4_4_ = (int)((ulong)uStack_14c0 >> 0x20);
        if (local_143c <= local_14cc) break;
        local_ce8 = local_13a0;
        local_14e8 = *local_13a0;
        lStack_14e0 = local_13a0[1];
        local_bc8 = 0;
        uStack_bc0 = 0;
        local_a88 = 0;
        uStack_a80 = 0;
        local_a98._0_1_ = (char)local_14e8;
        local_a98._1_1_ = (char)((ulong)local_14e8 >> 8);
        local_a98._2_1_ = (char)((ulong)local_14e8 >> 0x10);
        local_a98._3_1_ = (char)((ulong)local_14e8 >> 0x18);
        local_a98._4_1_ = (char)((ulong)local_14e8 >> 0x20);
        local_a98._5_1_ = (char)((ulong)local_14e8 >> 0x28);
        local_a98._6_1_ = (char)((ulong)local_14e8 >> 0x30);
        local_a98._7_1_ = (undefined1)((ulong)local_14e8 >> 0x38);
        uStack_a90._0_1_ = (char)lStack_14e0;
        uStack_a90._1_1_ = (char)((ulong)lStack_14e0 >> 8);
        uStack_a90._2_1_ = (char)((ulong)lStack_14e0 >> 0x10);
        uStack_a90._3_1_ = (char)((ulong)lStack_14e0 >> 0x18);
        uStack_a90._4_1_ = (char)((ulong)lStack_14e0 >> 0x20);
        uStack_a90._5_1_ = (char)((ulong)lStack_14e0 >> 0x28);
        uStack_a90._6_1_ = (char)((ulong)lStack_14e0 >> 0x30);
        uStack_a90._7_1_ = (undefined1)((ulong)lStack_14e0 >> 0x38);
        local_14f8 = CONCAT17(-(local_14e8 < 0),
                              CONCAT16(-(local_a98._6_1_ < '\0'),
                                       CONCAT15(-(local_a98._5_1_ < '\0'),
                                                CONCAT14(-(local_a98._4_1_ < '\0'),
                                                         CONCAT13(-(local_a98._3_1_ < '\0'),
                                                                  CONCAT12(-(local_a98._2_1_ < '\0')
                                                                           ,CONCAT11(-(local_a98.
                                                                                       _1_1_ < '\0')
                                                                                     ,-((char)
                                                  local_a98 < '\0'))))))));
        uStack_14f0 = CONCAT17(-(lStack_14e0 < 0),
                               CONCAT16(-(uStack_a90._6_1_ < '\0'),
                                        CONCAT15(-(uStack_a90._5_1_ < '\0'),
                                                 CONCAT14(-(uStack_a90._4_1_ < '\0'),
                                                          CONCAT13(-(uStack_a90._3_1_ < '\0'),
                                                                   CONCAT12(-(uStack_a90._2_1_ <
                                                                             '\0'),CONCAT11(-(
                                                  uStack_a90._1_1_ < '\0'),
                                                  -((char)uStack_a90 < '\0'))))))));
        sVar72 = CONCAT11(-((char)local_a98 < '\0'),(char)local_a98);
        uVar73 = CONCAT13(-(local_a98._1_1_ < '\0'),CONCAT12(local_a98._1_1_,sVar72));
        uVar74 = CONCAT15(-(local_a98._2_1_ < '\0'),CONCAT14(local_a98._2_1_,uVar73));
        local_1508 = CONCAT17(-(local_a98._3_1_ < '\0'),CONCAT16(local_a98._3_1_,uVar74));
        sVar75 = CONCAT11(-(local_a98._4_1_ < '\0'),local_a98._4_1_);
        uVar76 = CONCAT13(-(local_a98._5_1_ < '\0'),CONCAT12(local_a98._5_1_,sVar75));
        uVar77 = CONCAT15(-(local_a98._6_1_ < '\0'),CONCAT14(local_a98._6_1_,uVar76));
        uStack_1500 = CONCAT17(-(local_14e8 < 0),CONCAT16(local_a98._7_1_,uVar77));
        sVar98 = CONCAT11(-((char)uStack_a90 < '\0'),(char)uStack_a90);
        uVar44 = CONCAT13(-(uStack_a90._1_1_ < '\0'),CONCAT12(uStack_a90._1_1_,sVar98));
        uVar45 = CONCAT15(-(uStack_a90._2_1_ < '\0'),CONCAT14(uStack_a90._2_1_,uVar44));
        local_1518 = CONCAT17(-(uStack_a90._3_1_ < '\0'),CONCAT16(uStack_a90._3_1_,uVar45));
        sVar112 = CONCAT11(-(uStack_a90._4_1_ < '\0'),uStack_a90._4_1_);
        uVar46 = CONCAT13(-(uStack_a90._5_1_ < '\0'),CONCAT12(uStack_a90._5_1_,sVar112));
        uVar47 = CONCAT15(-(uStack_a90._6_1_ < '\0'),CONCAT14(uStack_a90._6_1_,uVar46));
        uStack_1510 = CONCAT17(-(lStack_14e0 < 0),CONCAT16(uStack_a90._7_1_,uVar47));
        local_cf0 = local_13f0;
        local_1528 = *local_13f0;
        lStack_1520 = local_13f0[1];
        local_cf8 = local_13f0 + 2;
        local_1538 = *local_cf8;
        lStack_1530 = local_13f0[3];
        local_bd8 = 0;
        uStack_bd0 = 0;
        local_aa8 = 0;
        uStack_aa0 = 0;
        local_ab8._0_1_ = (char)local_1528;
        local_ab8._1_1_ = (char)((ulong)local_1528 >> 8);
        local_ab8._2_1_ = (char)((ulong)local_1528 >> 0x10);
        local_ab8._3_1_ = (char)((ulong)local_1528 >> 0x18);
        local_ab8._4_1_ = (char)((ulong)local_1528 >> 0x20);
        local_ab8._5_1_ = (char)((ulong)local_1528 >> 0x28);
        local_ab8._6_1_ = (char)((ulong)local_1528 >> 0x30);
        local_ab8._7_1_ = (undefined1)((ulong)local_1528 >> 0x38);
        uStack_ab0._0_1_ = (char)lStack_1520;
        uStack_ab0._1_1_ = (char)((ulong)lStack_1520 >> 8);
        uStack_ab0._2_1_ = (char)((ulong)lStack_1520 >> 0x10);
        uStack_ab0._3_1_ = (char)((ulong)lStack_1520 >> 0x18);
        uStack_ab0._4_1_ = (char)((ulong)lStack_1520 >> 0x20);
        uStack_ab0._5_1_ = (char)((ulong)lStack_1520 >> 0x28);
        uStack_ab0._6_1_ = (char)((ulong)lStack_1520 >> 0x30);
        uStack_ab0._7_1_ = (undefined1)((ulong)lStack_1520 >> 0x38);
        local_1548 = CONCAT17(-(local_1528 < 0),
                              CONCAT16(-(local_ab8._6_1_ < '\0'),
                                       CONCAT15(-(local_ab8._5_1_ < '\0'),
                                                CONCAT14(-(local_ab8._4_1_ < '\0'),
                                                         CONCAT13(-(local_ab8._3_1_ < '\0'),
                                                                  CONCAT12(-(local_ab8._2_1_ < '\0')
                                                                           ,CONCAT11(-(local_ab8.
                                                                                       _1_1_ < '\0')
                                                                                     ,-((char)
                                                  local_ab8 < '\0'))))))));
        uStack_1540 = CONCAT17(-(lStack_1520 < 0),
                               CONCAT16(-(uStack_ab0._6_1_ < '\0'),
                                        CONCAT15(-(uStack_ab0._5_1_ < '\0'),
                                                 CONCAT14(-(uStack_ab0._4_1_ < '\0'),
                                                          CONCAT13(-(uStack_ab0._3_1_ < '\0'),
                                                                   CONCAT12(-(uStack_ab0._2_1_ <
                                                                             '\0'),CONCAT11(-(
                                                  uStack_ab0._1_1_ < '\0'),
                                                  -((char)uStack_ab0 < '\0'))))))));
        local_be8 = 0;
        uStack_be0 = 0;
        local_ac8 = 0;
        uStack_ac0 = 0;
        local_ad8._0_1_ = (char)local_1538;
        local_ad8._1_1_ = (char)((ulong)local_1538 >> 8);
        local_ad8._2_1_ = (char)((ulong)local_1538 >> 0x10);
        local_ad8._3_1_ = (char)((ulong)local_1538 >> 0x18);
        local_ad8._4_1_ = (char)((ulong)local_1538 >> 0x20);
        local_ad8._5_1_ = (char)((ulong)local_1538 >> 0x28);
        local_ad8._6_1_ = (char)((ulong)local_1538 >> 0x30);
        local_ad8._7_1_ = (undefined1)((ulong)local_1538 >> 0x38);
        uStack_ad0._0_1_ = (char)lStack_1530;
        uStack_ad0._1_1_ = (char)((ulong)lStack_1530 >> 8);
        uStack_ad0._2_1_ = (char)((ulong)lStack_1530 >> 0x10);
        uStack_ad0._3_1_ = (char)((ulong)lStack_1530 >> 0x18);
        uStack_ad0._4_1_ = (char)((ulong)lStack_1530 >> 0x20);
        uStack_ad0._5_1_ = (char)((ulong)lStack_1530 >> 0x28);
        uStack_ad0._6_1_ = (char)((ulong)lStack_1530 >> 0x30);
        uStack_ad0._7_1_ = (undefined1)((ulong)lStack_1530 >> 0x38);
        local_1558 = CONCAT17(-(local_1538 < 0),
                              CONCAT16(-(local_ad8._6_1_ < '\0'),
                                       CONCAT15(-(local_ad8._5_1_ < '\0'),
                                                CONCAT14(-(local_ad8._4_1_ < '\0'),
                                                         CONCAT13(-(local_ad8._3_1_ < '\0'),
                                                                  CONCAT12(-(local_ad8._2_1_ < '\0')
                                                                           ,CONCAT11(-(local_ad8.
                                                                                       _1_1_ < '\0')
                                                                                     ,-((char)
                                                  local_ad8 < '\0'))))))));
        uStack_1550 = CONCAT17(-(lStack_1530 < 0),
                               CONCAT16(-(uStack_ad0._6_1_ < '\0'),
                                        CONCAT15(-(uStack_ad0._5_1_ < '\0'),
                                                 CONCAT14(-(uStack_ad0._4_1_ < '\0'),
                                                          CONCAT13(-(uStack_ad0._3_1_ < '\0'),
                                                                   CONCAT12(-(uStack_ad0._2_1_ <
                                                                             '\0'),CONCAT11(-(
                                                  uStack_ad0._1_1_ < '\0'),
                                                  -((char)uStack_ad0 < '\0'))))))));
        sVar95 = CONCAT11(-((char)local_ab8 < '\0'),(char)local_ab8);
        uVar40 = CONCAT13(-(local_ab8._1_1_ < '\0'),CONCAT12(local_ab8._1_1_,sVar95));
        uVar41 = CONCAT15(-(local_ab8._2_1_ < '\0'),CONCAT14(local_ab8._2_1_,uVar40));
        local_1568 = CONCAT17(-(local_ab8._3_1_ < '\0'),CONCAT16(local_ab8._3_1_,uVar41));
        sVar109 = CONCAT11(-(local_ab8._4_1_ < '\0'),local_ab8._4_1_);
        uVar42 = CONCAT13(-(local_ab8._5_1_ < '\0'),CONCAT12(local_ab8._5_1_,sVar109));
        uVar43 = CONCAT15(-(local_ab8._6_1_ < '\0'),CONCAT14(local_ab8._6_1_,uVar42));
        uStack_1560 = CONCAT17(-(local_1528 < 0),CONCAT16(local_ab8._7_1_,uVar43));
        sVar96 = CONCAT11(-((char)uStack_ab0 < '\0'),(char)uStack_ab0);
        uVar36 = CONCAT13(-(uStack_ab0._1_1_ < '\0'),CONCAT12(uStack_ab0._1_1_,sVar96));
        uVar37 = CONCAT15(-(uStack_ab0._2_1_ < '\0'),CONCAT14(uStack_ab0._2_1_,uVar36));
        local_1578 = CONCAT17(-(uStack_ab0._3_1_ < '\0'),CONCAT16(uStack_ab0._3_1_,uVar37));
        sVar110 = CONCAT11(-(uStack_ab0._4_1_ < '\0'),uStack_ab0._4_1_);
        uVar38 = CONCAT13(-(uStack_ab0._5_1_ < '\0'),CONCAT12(uStack_ab0._5_1_,sVar110));
        uVar39 = CONCAT15(-(uStack_ab0._6_1_ < '\0'),CONCAT14(uStack_ab0._6_1_,uVar38));
        uStack_1570 = CONCAT17(-(lStack_1520 < 0),CONCAT16(uStack_ab0._7_1_,uVar39));
        sVar97 = CONCAT11(-((char)local_ad8 < '\0'),(char)local_ad8);
        uVar32 = CONCAT13(-(local_ad8._1_1_ < '\0'),CONCAT12(local_ad8._1_1_,sVar97));
        uVar33 = CONCAT15(-(local_ad8._2_1_ < '\0'),CONCAT14(local_ad8._2_1_,uVar32));
        local_1588 = CONCAT17(-(local_ad8._3_1_ < '\0'),CONCAT16(local_ad8._3_1_,uVar33));
        sVar111 = CONCAT11(-(local_ad8._4_1_ < '\0'),local_ad8._4_1_);
        uVar34 = CONCAT13(-(local_ad8._5_1_ < '\0'),CONCAT12(local_ad8._5_1_,sVar111));
        uVar35 = CONCAT15(-(local_ad8._6_1_ < '\0'),CONCAT14(local_ad8._6_1_,uVar34));
        uStack_1580 = CONCAT17(-(local_1538 < 0),CONCAT16(local_ad8._7_1_,uVar35));
        sVar26 = CONCAT11(-((char)uStack_ad0 < '\0'),(char)uStack_ad0);
        uVar27 = CONCAT13(-(uStack_ad0._1_1_ < '\0'),CONCAT12(uStack_ad0._1_1_,sVar26));
        uVar28 = CONCAT15(-(uStack_ad0._2_1_ < '\0'),CONCAT14(uStack_ad0._2_1_,uVar27));
        local_1598 = CONCAT17(-(uStack_ad0._3_1_ < '\0'),CONCAT16(uStack_ad0._3_1_,uVar28));
        sVar29 = CONCAT11(-(uStack_ad0._4_1_ < '\0'),uStack_ad0._4_1_);
        uVar30 = CONCAT13(-(uStack_ad0._5_1_ < '\0'),CONCAT12(uStack_ad0._5_1_,sVar29));
        uVar31 = CONCAT15(-(uStack_ad0._6_1_ < '\0'),CONCAT14(uStack_ad0._6_1_,uVar30));
        uStack_1590 = CONCAT17(-(lStack_1530 < 0),CONCAT16(uStack_ad0._7_1_,uVar31));
        local_7a8._2_2_ = (short)((uint)uVar73 >> 0x10);
        local_7a8._4_2_ = (short)((uint6)uVar74 >> 0x20);
        local_7a8._6_2_ = (short)((ulong)local_1508 >> 0x30);
        uStack_7a0._2_2_ = (short)((uint)uVar76 >> 0x10);
        uStack_7a0._4_2_ = (short)((uint6)uVar77 >> 0x20);
        uStack_7a0._6_2_ = (short)((ulong)uStack_1500 >> 0x30);
        local_7b8._2_2_ = (short)((uint)uVar40 >> 0x10);
        local_7b8._4_2_ = (short)((uint6)uVar41 >> 0x20);
        local_7b8._6_2_ = (short)((ulong)local_1568 >> 0x30);
        uStack_7b0._2_2_ = (short)((uint)uVar42 >> 0x10);
        uStack_7b0._4_2_ = (short)((uint6)uVar43 >> 0x20);
        uStack_7b0._6_2_ = (short)((ulong)uStack_1560 >> 0x30);
        local_15a8 = CONCAT26(local_7a8._6_2_ * local_7b8._6_2_,
                              CONCAT24(local_7a8._4_2_ * local_7b8._4_2_,
                                       CONCAT22(local_7a8._2_2_ * local_7b8._2_2_,sVar72 * sVar95)))
        ;
        uStack_15a0 = CONCAT26(uStack_7a0._6_2_ * uStack_7b0._6_2_,
                               CONCAT24(uStack_7a0._4_2_ * uStack_7b0._4_2_,
                                        CONCAT22(uStack_7a0._2_2_ * uStack_7b0._2_2_,
                                                 sVar75 * sVar109)));
        auVar91._8_8_ = uStack_1500;
        auVar91._0_8_ = local_1508;
        auVar99._8_8_ = uStack_1560;
        auVar99._0_8_ = local_1568;
        auVar99 = pmulhw(auVar91,auVar99);
        local_1b68 = auVar99._0_8_;
        local_15b8 = local_1b68;
        uStack_1b60 = auVar99._8_8_;
        uStack_15b0 = uStack_1b60;
        local_7d8._2_2_ = (short)((uint)uVar36 >> 0x10);
        local_7d8._4_2_ = (short)((uint6)uVar37 >> 0x20);
        local_7d8._6_2_ = (short)((ulong)local_1578 >> 0x30);
        uStack_7d0._2_2_ = (short)((uint)uVar38 >> 0x10);
        uStack_7d0._4_2_ = (short)((uint6)uVar39 >> 0x20);
        uStack_7d0._6_2_ = (short)((ulong)uStack_1570 >> 0x30);
        local_15c8 = CONCAT26(local_7a8._6_2_ * local_7d8._6_2_,
                              CONCAT24(local_7a8._4_2_ * local_7d8._4_2_,
                                       CONCAT22(local_7a8._2_2_ * local_7d8._2_2_,sVar72 * sVar96)))
        ;
        uStack_15c0 = CONCAT26(uStack_7a0._6_2_ * uStack_7d0._6_2_,
                               CONCAT24(uStack_7a0._4_2_ * uStack_7d0._4_2_,
                                        CONCAT22(uStack_7a0._2_2_ * uStack_7d0._2_2_,
                                                 sVar75 * sVar110)));
        auVar90._8_8_ = uStack_1500;
        auVar90._0_8_ = local_1508;
        auVar100._8_8_ = uStack_1570;
        auVar100._0_8_ = local_1578;
        auVar100 = pmulhw(auVar90,auVar100);
        local_1b88 = auVar100._0_8_;
        local_15d8 = local_1b88;
        uStack_1b80 = auVar100._8_8_;
        uStack_15d0 = uStack_1b80;
        local_7f8._2_2_ = (short)((uint)uVar32 >> 0x10);
        local_7f8._4_2_ = (short)((uint6)uVar33 >> 0x20);
        local_7f8._6_2_ = (short)((ulong)local_1588 >> 0x30);
        uStack_7f0._2_2_ = (short)((uint)uVar34 >> 0x10);
        uStack_7f0._4_2_ = (short)((uint6)uVar35 >> 0x20);
        uStack_7f0._6_2_ = (short)((ulong)uStack_1580 >> 0x30);
        local_15e8 = CONCAT26(local_7a8._6_2_ * local_7f8._6_2_,
                              CONCAT24(local_7a8._4_2_ * local_7f8._4_2_,
                                       CONCAT22(local_7a8._2_2_ * local_7f8._2_2_,sVar72 * sVar97)))
        ;
        uStack_15e0 = CONCAT26(uStack_7a0._6_2_ * uStack_7f0._6_2_,
                               CONCAT24(uStack_7a0._4_2_ * uStack_7f0._4_2_,
                                        CONCAT22(uStack_7a0._2_2_ * uStack_7f0._2_2_,
                                                 sVar75 * sVar111)));
        auVar89._8_8_ = uStack_1500;
        auVar89._0_8_ = local_1508;
        auVar101._8_8_ = uStack_1580;
        auVar101._0_8_ = local_1588;
        auVar101 = pmulhw(auVar89,auVar101);
        local_1ba8 = auVar101._0_8_;
        local_15f8 = local_1ba8;
        uStack_1ba0 = auVar101._8_8_;
        uStack_15f0 = uStack_1ba0;
        local_818._2_2_ = (short)((uint)uVar27 >> 0x10);
        local_818._4_2_ = (short)((uint6)uVar28 >> 0x20);
        local_818._6_2_ = (short)((ulong)local_1598 >> 0x30);
        uStack_810._2_2_ = (short)((uint)uVar30 >> 0x10);
        uStack_810._4_2_ = (short)((uint6)uVar31 >> 0x20);
        uStack_810._6_2_ = (short)((ulong)uStack_1590 >> 0x30);
        local_1608 = CONCAT26(local_7a8._6_2_ * local_818._6_2_,
                              CONCAT24(local_7a8._4_2_ * local_818._4_2_,
                                       CONCAT22(local_7a8._2_2_ * local_818._2_2_,sVar72 * sVar26)))
        ;
        uStack_1600 = CONCAT26(uStack_7a0._6_2_ * uStack_810._6_2_,
                               CONCAT24(uStack_7a0._4_2_ * uStack_810._4_2_,
                                        CONCAT22(uStack_7a0._2_2_ * uStack_810._2_2_,sVar75 * sVar29
                                                )));
        auVar88._8_8_ = uStack_1500;
        auVar88._0_8_ = local_1508;
        auVar102._8_8_ = uStack_1590;
        auVar102._0_8_ = local_1598;
        auVar102 = pmulhw(auVar88,auVar102);
        local_1bc8 = auVar102._0_8_;
        local_1618 = local_1bc8;
        uStack_1bc0 = auVar102._8_8_;
        uStack_1610 = uStack_1bc0;
        local_828._2_2_ = (short)((uint)uVar44 >> 0x10);
        local_828._4_2_ = (short)((uint6)uVar45 >> 0x20);
        local_828._6_2_ = (short)((ulong)local_1518 >> 0x30);
        uStack_820._2_2_ = (short)((uint)uVar46 >> 0x10);
        uStack_820._4_2_ = (short)((uint6)uVar47 >> 0x20);
        uStack_820._6_2_ = (short)((ulong)uStack_1510 >> 0x30);
        local_1628 = CONCAT26(local_828._6_2_ * local_7b8._6_2_,
                              CONCAT24(local_828._4_2_ * local_7b8._4_2_,
                                       CONCAT22(local_828._2_2_ * local_7b8._2_2_,sVar98 * sVar95)))
        ;
        uStack_1620 = CONCAT26(uStack_820._6_2_ * uStack_7b0._6_2_,
                               CONCAT24(uStack_820._4_2_ * uStack_7b0._4_2_,
                                        CONCAT22(uStack_820._2_2_ * uStack_7b0._2_2_,
                                                 sVar112 * sVar109)));
        auVar87._8_8_ = uStack_1510;
        auVar87._0_8_ = local_1518;
        auVar103._8_8_ = uStack_1560;
        auVar103._0_8_ = local_1568;
        auVar103 = pmulhw(auVar87,auVar103);
        local_1be8 = auVar103._0_8_;
        local_1638 = local_1be8;
        uStack_1be0 = auVar103._8_8_;
        uStack_1630 = uStack_1be0;
        local_1648 = CONCAT26(local_828._6_2_ * local_7d8._6_2_,
                              CONCAT24(local_828._4_2_ * local_7d8._4_2_,
                                       CONCAT22(local_828._2_2_ * local_7d8._2_2_,sVar98 * sVar96)))
        ;
        uStack_1640 = CONCAT26(uStack_820._6_2_ * uStack_7d0._6_2_,
                               CONCAT24(uStack_820._4_2_ * uStack_7d0._4_2_,
                                        CONCAT22(uStack_820._2_2_ * uStack_7d0._2_2_,
                                                 sVar112 * sVar110)));
        auVar86._8_8_ = uStack_1510;
        auVar86._0_8_ = local_1518;
        auVar104._8_8_ = uStack_1570;
        auVar104._0_8_ = local_1578;
        auVar104 = pmulhw(auVar86,auVar104);
        local_1c08 = auVar104._0_8_;
        local_1658 = local_1c08;
        uStack_1c00 = auVar104._8_8_;
        uStack_1650 = uStack_1c00;
        local_1668 = CONCAT26(local_828._6_2_ * local_7f8._6_2_,
                              CONCAT24(local_828._4_2_ * local_7f8._4_2_,
                                       CONCAT22(local_828._2_2_ * local_7f8._2_2_,sVar98 * sVar97)))
        ;
        uStack_1660 = CONCAT26(uStack_820._6_2_ * uStack_7f0._6_2_,
                               CONCAT24(uStack_820._4_2_ * uStack_7f0._4_2_,
                                        CONCAT22(uStack_820._2_2_ * uStack_7f0._2_2_,
                                                 sVar112 * sVar111)));
        auVar108._8_8_ = uStack_1510;
        auVar108._0_8_ = local_1518;
        auVar105._8_8_ = uStack_1580;
        auVar105._0_8_ = local_1588;
        auVar105 = pmulhw(auVar108,auVar105);
        local_1c28 = auVar105._0_8_;
        local_1678 = local_1c28;
        uStack_1c20 = auVar105._8_8_;
        uStack_1670 = uStack_1c20;
        local_1688 = CONCAT26(local_828._6_2_ * local_818._6_2_,
                              CONCAT24(local_828._4_2_ * local_818._4_2_,
                                       CONCAT22(local_828._2_2_ * local_818._2_2_,sVar98 * sVar26)))
        ;
        uStack_1680 = CONCAT26(uStack_820._6_2_ * uStack_810._6_2_,
                               CONCAT24(uStack_820._4_2_ * uStack_810._4_2_,
                                        CONCAT22(uStack_820._2_2_ * uStack_810._2_2_,
                                                 sVar112 * sVar29)));
        auVar107._8_8_ = uStack_1510;
        auVar107._0_8_ = local_1518;
        auVar106._8_8_ = uStack_1590;
        auVar106._0_8_ = local_1598;
        auVar106 = pmulhw(auVar107,auVar106);
        local_1c48 = auVar106._0_8_;
        local_1698 = local_1c48;
        uStack_1c40 = auVar106._8_8_;
        uStack_1690 = uStack_1c40;
        uStack_4b0 = uStack_1b60;
        local_4b8._0_2_ = auVar99._0_2_;
        local_4b8._2_2_ = auVar99._2_2_;
        local_4b8._4_2_ = auVar99._4_2_;
        local_4b8._6_2_ = auVar99._6_2_;
        iVar113 = CONCAT22((undefined2)local_4b8,sVar72 * sVar95);
        uVar70 = CONCAT26(local_4b8._2_2_,CONCAT24(local_7a8._2_2_ * local_7b8._2_2_,iVar113));
        iVar17 = CONCAT22(local_4b8._4_2_,local_7a8._4_2_ * local_7b8._4_2_);
        uVar71 = CONCAT26(local_4b8._6_2_,CONCAT24(local_7a8._6_2_ * local_7b8._6_2_,iVar17));
        uVar1 = local_1458;
        uVar2 = uStack_1450;
        local_d28._4_4_ = (int)((ulong)uVar70 >> 0x20);
        uStack_d20._4_4_ = (int)((ulong)uVar71 >> 0x20);
        local_d18._0_4_ = (int)local_d18 + iVar113;
        uStack_d10._0_4_ = (int)uStack_d10 + iVar17;
        local_1458 = CONCAT44(local_d18._4_4_ + local_d28._4_4_,(int)local_d18);
        uStack_1450 = CONCAT44(uStack_d10._4_4_ + uStack_d20._4_4_,(int)uStack_d10);
        uStack_4d0 = uStack_1b80;
        local_4d8._0_2_ = auVar100._0_2_;
        local_4d8._2_2_ = auVar100._2_2_;
        local_4d8._4_2_ = auVar100._4_2_;
        local_4d8._6_2_ = auVar100._6_2_;
        iVar113 = CONCAT22((undefined2)local_4d8,sVar72 * sVar96);
        uVar68 = CONCAT26(local_4d8._2_2_,CONCAT24(local_7a8._2_2_ * local_7d8._2_2_,iVar113));
        iVar17 = CONCAT22(local_4d8._4_2_,local_7a8._4_2_ * local_7d8._4_2_);
        uVar69 = CONCAT26(local_4d8._6_2_,CONCAT24(local_7a8._6_2_ * local_7d8._6_2_,iVar17));
        uVar3 = local_1468;
        uVar4 = uStack_1460;
        local_d48._4_4_ = (int)((ulong)uVar68 >> 0x20);
        uStack_d40._4_4_ = (int)((ulong)uVar69 >> 0x20);
        local_d38._0_4_ = (int)local_d38 + iVar113;
        uStack_d30._0_4_ = (int)uStack_d30 + iVar17;
        local_1468 = CONCAT44(local_d38._4_4_ + local_d48._4_4_,(int)local_d38);
        uStack_1460 = CONCAT44(uStack_d30._4_4_ + uStack_d40._4_4_,(int)uStack_d30);
        uStack_4f0 = uStack_1ba0;
        local_4f8._0_2_ = auVar101._0_2_;
        local_4f8._2_2_ = auVar101._2_2_;
        local_4f8._4_2_ = auVar101._4_2_;
        local_4f8._6_2_ = auVar101._6_2_;
        iVar113 = CONCAT22((undefined2)local_4f8,sVar72 * sVar97);
        uVar66 = CONCAT26(local_4f8._2_2_,CONCAT24(local_7a8._2_2_ * local_7f8._2_2_,iVar113));
        iVar17 = CONCAT22(local_4f8._4_2_,local_7a8._4_2_ * local_7f8._4_2_);
        uVar67 = CONCAT26(local_4f8._6_2_,CONCAT24(local_7a8._6_2_ * local_7f8._6_2_,iVar17));
        uVar5 = local_1478;
        uVar6 = uStack_1470;
        local_d68._4_4_ = (int)((ulong)uVar66 >> 0x20);
        uStack_d60._4_4_ = (int)((ulong)uVar67 >> 0x20);
        local_d58._0_4_ = (int)local_d58 + iVar113;
        uStack_d50._0_4_ = (int)uStack_d50 + iVar17;
        local_1478 = CONCAT44(local_d58._4_4_ + local_d68._4_4_,(int)local_d58);
        uStack_1470 = CONCAT44(uStack_d50._4_4_ + uStack_d60._4_4_,(int)uStack_d50);
        uStack_510 = uStack_1bc0;
        local_518._0_2_ = auVar102._0_2_;
        local_518._2_2_ = auVar102._2_2_;
        local_518._4_2_ = auVar102._4_2_;
        local_518._6_2_ = auVar102._6_2_;
        iVar113 = CONCAT22((undefined2)local_518,sVar72 * sVar26);
        uVar64 = CONCAT26(local_518._2_2_,CONCAT24(local_7a8._2_2_ * local_818._2_2_,iVar113));
        iVar17 = CONCAT22(local_518._4_2_,local_7a8._4_2_ * local_818._4_2_);
        uVar65 = CONCAT26(local_518._6_2_,CONCAT24(local_7a8._6_2_ * local_818._6_2_,iVar17));
        uVar7 = local_1488;
        uVar8 = uStack_1480;
        local_d88._4_4_ = (int)((ulong)uVar64 >> 0x20);
        uStack_d80._4_4_ = (int)((ulong)uVar65 >> 0x20);
        local_d78._0_4_ = (int)local_d78 + iVar113;
        uStack_d70._0_4_ = (int)uStack_d70 + iVar17;
        local_1488 = CONCAT44(local_d78._4_4_ + local_d88._4_4_,(int)local_d78);
        uStack_1480 = CONCAT44(uStack_d70._4_4_ + uStack_d80._4_4_,(int)uStack_d70);
        local_338 = local_1b68;
        uStack_330._0_2_ = auVar99._8_2_;
        uStack_330._2_2_ = auVar99._10_2_;
        uStack_330._4_2_ = auVar99._12_2_;
        uStack_330._6_2_ = auVar99._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_330,sVar75 * sVar109);
        uVar62 = CONCAT26(uStack_330._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_7b0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_330._4_2_,uStack_7a0._4_2_ * uStack_7b0._4_2_);
        uVar63 = CONCAT26(uStack_330._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_7b0._6_2_,iVar17));
        local_d98 = local_1458;
        uStack_d90 = uStack_1450;
        local_da8._4_4_ = (int)((ulong)uVar62 >> 0x20);
        uStack_da0._4_4_ = (int)((ulong)uVar63 >> 0x20);
        local_1458 = CONCAT44(local_d18._4_4_ + local_d28._4_4_ + local_da8._4_4_,
                              (int)local_d18 + iVar113);
        uStack_1450 = CONCAT44(uStack_d10._4_4_ + uStack_d20._4_4_ + uStack_da0._4_4_,
                               (int)uStack_d10 + iVar17);
        local_358 = local_1b88;
        uStack_350._0_2_ = auVar100._8_2_;
        uStack_350._2_2_ = auVar100._10_2_;
        uStack_350._4_2_ = auVar100._12_2_;
        uStack_350._6_2_ = auVar100._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_350,sVar75 * sVar110);
        uVar60 = CONCAT26(uStack_350._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_7d0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_350._4_2_,uStack_7a0._4_2_ * uStack_7d0._4_2_);
        uVar61 = CONCAT26(uStack_350._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_7d0._6_2_,iVar17));
        local_db8 = local_1468;
        uStack_db0 = uStack_1460;
        local_dc8._4_4_ = (int)((ulong)uVar60 >> 0x20);
        uStack_dc0._4_4_ = (int)((ulong)uVar61 >> 0x20);
        local_1468 = CONCAT44(local_d38._4_4_ + local_d48._4_4_ + local_dc8._4_4_,
                              (int)local_d38 + iVar113);
        uStack_1460 = CONCAT44(uStack_d30._4_4_ + uStack_d40._4_4_ + uStack_dc0._4_4_,
                               (int)uStack_d30 + iVar17);
        local_378 = local_1ba8;
        uStack_370._0_2_ = auVar101._8_2_;
        uStack_370._2_2_ = auVar101._10_2_;
        uStack_370._4_2_ = auVar101._12_2_;
        uStack_370._6_2_ = auVar101._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_370,sVar75 * sVar111);
        uVar58 = CONCAT26(uStack_370._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_7f0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_370._4_2_,uStack_7a0._4_2_ * uStack_7f0._4_2_);
        uVar59 = CONCAT26(uStack_370._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_7f0._6_2_,iVar17));
        local_dd8 = local_1478;
        uStack_dd0 = uStack_1470;
        local_de8._4_4_ = (int)((ulong)uVar58 >> 0x20);
        uStack_de0._4_4_ = (int)((ulong)uVar59 >> 0x20);
        local_1478 = CONCAT44(local_d58._4_4_ + local_d68._4_4_ + local_de8._4_4_,
                              (int)local_d58 + iVar113);
        uStack_1470 = CONCAT44(uStack_d50._4_4_ + uStack_d60._4_4_ + uStack_de0._4_4_,
                               (int)uStack_d50 + iVar17);
        local_398 = local_1bc8;
        uStack_390._0_2_ = auVar102._8_2_;
        uStack_390._2_2_ = auVar102._10_2_;
        uStack_390._4_2_ = auVar102._12_2_;
        uStack_390._6_2_ = auVar102._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_390,sVar75 * sVar29);
        uVar56 = CONCAT26(uStack_390._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_810._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_390._4_2_,uStack_7a0._4_2_ * uStack_810._4_2_);
        uVar57 = CONCAT26(uStack_390._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_810._6_2_,iVar17));
        local_df8 = local_1488;
        uStack_df0 = uStack_1480;
        local_e08._4_4_ = (int)((ulong)uVar56 >> 0x20);
        uStack_e00._4_4_ = (int)((ulong)uVar57 >> 0x20);
        local_1488 = CONCAT44(local_d78._4_4_ + local_d88._4_4_ + local_e08._4_4_,
                              (int)local_d78 + iVar113);
        uStack_1480 = CONCAT44(uStack_d70._4_4_ + uStack_d80._4_4_ + uStack_e00._4_4_,
                               (int)uStack_d70 + iVar17);
        uStack_530 = uStack_1be0;
        local_538._0_2_ = auVar103._0_2_;
        local_538._2_2_ = auVar103._2_2_;
        local_538._4_2_ = auVar103._4_2_;
        local_538._6_2_ = auVar103._6_2_;
        iVar113 = CONCAT22((undefined2)local_538,sVar98 * sVar95);
        uVar54 = CONCAT26(local_538._2_2_,CONCAT24(local_828._2_2_ * local_7b8._2_2_,iVar113));
        iVar17 = CONCAT22(local_538._4_2_,local_828._4_2_ * local_7b8._4_2_);
        uVar55 = CONCAT26(local_538._6_2_,CONCAT24(local_828._6_2_ * local_7b8._6_2_,iVar17));
        uVar9 = local_1498;
        uVar10 = uStack_1490;
        local_e28._4_4_ = (int)((ulong)uVar54 >> 0x20);
        uStack_e20._4_4_ = (int)((ulong)uVar55 >> 0x20);
        local_e18._0_4_ = (int)local_e18 + iVar113;
        uStack_e10._0_4_ = (int)uStack_e10 + iVar17;
        local_1498 = CONCAT44(local_e18._4_4_ + local_e28._4_4_,(int)local_e18);
        uStack_1490 = CONCAT44(uStack_e10._4_4_ + uStack_e20._4_4_,(int)uStack_e10);
        uStack_550 = uStack_1c00;
        local_558._0_2_ = auVar104._0_2_;
        local_558._2_2_ = auVar104._2_2_;
        local_558._4_2_ = auVar104._4_2_;
        local_558._6_2_ = auVar104._6_2_;
        iVar113 = CONCAT22((undefined2)local_558,sVar98 * sVar96);
        uVar52 = CONCAT26(local_558._2_2_,CONCAT24(local_828._2_2_ * local_7d8._2_2_,iVar113));
        iVar17 = CONCAT22(local_558._4_2_,local_828._4_2_ * local_7d8._4_2_);
        uVar53 = CONCAT26(local_558._6_2_,CONCAT24(local_828._6_2_ * local_7d8._6_2_,iVar17));
        uVar11 = local_14a8;
        uVar12 = uStack_14a0;
        local_e48._4_4_ = (int)((ulong)uVar52 >> 0x20);
        uStack_e40._4_4_ = (int)((ulong)uVar53 >> 0x20);
        local_e38._0_4_ = (int)local_e38 + iVar113;
        uStack_e30._0_4_ = (int)uStack_e30 + iVar17;
        local_14a8 = CONCAT44(local_e38._4_4_ + local_e48._4_4_,(int)local_e38);
        uStack_14a0 = CONCAT44(uStack_e30._4_4_ + uStack_e40._4_4_,(int)uStack_e30);
        uStack_570 = uStack_1c20;
        local_578._0_2_ = auVar105._0_2_;
        local_578._2_2_ = auVar105._2_2_;
        local_578._4_2_ = auVar105._4_2_;
        local_578._6_2_ = auVar105._6_2_;
        iVar113 = CONCAT22((undefined2)local_578,sVar98 * sVar97);
        uVar50 = CONCAT26(local_578._2_2_,CONCAT24(local_828._2_2_ * local_7f8._2_2_,iVar113));
        iVar17 = CONCAT22(local_578._4_2_,local_828._4_2_ * local_7f8._4_2_);
        uVar51 = CONCAT26(local_578._6_2_,CONCAT24(local_828._6_2_ * local_7f8._6_2_,iVar17));
        uVar13 = local_14b8;
        uVar14 = uStack_14b0;
        local_e68._4_4_ = (int)((ulong)uVar50 >> 0x20);
        uStack_e60._4_4_ = (int)((ulong)uVar51 >> 0x20);
        local_e58._0_4_ = (int)local_e58 + iVar113;
        uStack_e50._0_4_ = (int)uStack_e50 + iVar17;
        local_14b8 = CONCAT44(local_e58._4_4_ + local_e68._4_4_,(int)local_e58);
        uStack_14b0 = CONCAT44(uStack_e50._4_4_ + uStack_e60._4_4_,(int)uStack_e50);
        uStack_590 = uStack_1c40;
        local_598._0_2_ = auVar106._0_2_;
        local_598._2_2_ = auVar106._2_2_;
        local_598._4_2_ = auVar106._4_2_;
        local_598._6_2_ = auVar106._6_2_;
        iVar113 = CONCAT22((undefined2)local_598,sVar98 * sVar26);
        uVar48 = CONCAT26(local_598._2_2_,CONCAT24(local_828._2_2_ * local_818._2_2_,iVar113));
        iVar17 = CONCAT22(local_598._4_2_,local_828._4_2_ * local_818._4_2_);
        uVar49 = CONCAT26(local_598._6_2_,CONCAT24(local_828._6_2_ * local_818._6_2_,iVar17));
        uVar15 = local_14c8;
        uVar16 = uStack_14c0;
        local_e88._4_4_ = (int)((ulong)uVar48 >> 0x20);
        uStack_e80._4_4_ = (int)((ulong)uVar49 >> 0x20);
        local_e78._0_4_ = (int)local_e78 + iVar113;
        uStack_e70._0_4_ = (int)uStack_e70 + iVar17;
        local_14c8 = CONCAT44(local_e78._4_4_ + local_e88._4_4_,(int)local_e78);
        uStack_14c0 = CONCAT44(uStack_e70._4_4_ + uStack_e80._4_4_,(int)uStack_e70);
        local_3b8 = local_1be8;
        uStack_3b0._0_2_ = auVar103._8_2_;
        uStack_3b0._2_2_ = auVar103._10_2_;
        uStack_3b0._4_2_ = auVar103._12_2_;
        uStack_3b0._6_2_ = auVar103._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_3b0,sVar112 * sVar109);
        uVar24 = CONCAT26(uStack_3b0._2_2_,CONCAT24(uStack_820._2_2_ * uStack_7b0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_3b0._4_2_,uStack_820._4_2_ * uStack_7b0._4_2_);
        uVar25 = CONCAT26(uStack_3b0._6_2_,CONCAT24(uStack_820._6_2_ * uStack_7b0._6_2_,iVar17));
        local_e98 = local_1498;
        uStack_e90 = uStack_1490;
        local_ea8._4_4_ = (int)((ulong)uVar24 >> 0x20);
        uStack_ea0._4_4_ = (int)((ulong)uVar25 >> 0x20);
        local_1498 = CONCAT44(local_e18._4_4_ + local_e28._4_4_ + local_ea8._4_4_,
                              (int)local_e18 + iVar113);
        uStack_1490 = CONCAT44(uStack_e10._4_4_ + uStack_e20._4_4_ + uStack_ea0._4_4_,
                               (int)uStack_e10 + iVar17);
        local_3d8 = local_1c08;
        uStack_3d0._0_2_ = auVar104._8_2_;
        uStack_3d0._2_2_ = auVar104._10_2_;
        uStack_3d0._4_2_ = auVar104._12_2_;
        uStack_3d0._6_2_ = auVar104._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_3d0,sVar112 * sVar110);
        uVar22 = CONCAT26(uStack_3d0._2_2_,CONCAT24(uStack_820._2_2_ * uStack_7d0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_3d0._4_2_,uStack_820._4_2_ * uStack_7d0._4_2_);
        uVar23 = CONCAT26(uStack_3d0._6_2_,CONCAT24(uStack_820._6_2_ * uStack_7d0._6_2_,iVar17));
        local_eb8 = local_14a8;
        uStack_eb0 = uStack_14a0;
        local_ec8._4_4_ = (int)((ulong)uVar22 >> 0x20);
        uStack_ec0._4_4_ = (int)((ulong)uVar23 >> 0x20);
        local_14a8 = CONCAT44(local_e38._4_4_ + local_e48._4_4_ + local_ec8._4_4_,
                              (int)local_e38 + iVar113);
        uStack_14a0 = CONCAT44(uStack_e30._4_4_ + uStack_e40._4_4_ + uStack_ec0._4_4_,
                               (int)uStack_e30 + iVar17);
        local_3f8 = local_1c28;
        uStack_3f0._0_2_ = auVar105._8_2_;
        uStack_3f0._2_2_ = auVar105._10_2_;
        uStack_3f0._4_2_ = auVar105._12_2_;
        uStack_3f0._6_2_ = auVar105._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_3f0,sVar112 * sVar111);
        uVar20 = CONCAT26(uStack_3f0._2_2_,CONCAT24(uStack_820._2_2_ * uStack_7f0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_3f0._4_2_,uStack_820._4_2_ * uStack_7f0._4_2_);
        uVar21 = CONCAT26(uStack_3f0._6_2_,CONCAT24(uStack_820._6_2_ * uStack_7f0._6_2_,iVar17));
        local_ed8 = local_14b8;
        uStack_ed0 = uStack_14b0;
        local_ee8._4_4_ = (int)((ulong)uVar20 >> 0x20);
        uStack_ee0._4_4_ = (int)((ulong)uVar21 >> 0x20);
        local_14b8 = CONCAT44(local_e58._4_4_ + local_e68._4_4_ + local_ee8._4_4_,
                              (int)local_e58 + iVar113);
        uStack_14b0 = CONCAT44(uStack_e50._4_4_ + uStack_e60._4_4_ + uStack_ee0._4_4_,
                               (int)uStack_e50 + iVar17);
        local_418 = local_1c48;
        uStack_410._0_2_ = auVar106._8_2_;
        uStack_410._2_2_ = auVar106._10_2_;
        uStack_410._4_2_ = auVar106._12_2_;
        uStack_410._6_2_ = auVar106._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_410,sVar112 * sVar29);
        uVar18 = CONCAT26(uStack_410._2_2_,CONCAT24(uStack_820._2_2_ * uStack_810._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_410._4_2_,uStack_820._4_2_ * uStack_810._4_2_);
        uVar19 = CONCAT26(uStack_410._6_2_,CONCAT24(uStack_820._6_2_ * uStack_810._6_2_,iVar17));
        local_ef8 = local_14c8;
        uStack_ef0 = uStack_14c0;
        local_f08._4_4_ = (int)((ulong)uVar18 >> 0x20);
        uStack_f00._4_4_ = (int)((ulong)uVar19 >> 0x20);
        local_14c8 = CONCAT44(local_e78._4_4_ + local_e88._4_4_ + local_f08._4_4_,
                              (int)local_e78 + iVar113);
        uStack_14c0 = CONCAT44(uStack_e70._4_4_ + uStack_e80._4_4_ + uStack_f00._4_4_,
                               (int)uStack_e70 + iVar17);
        local_13a0 = local_13a0 + 2;
        local_13f0 = local_13f0 + 4;
        local_14cc = local_14cc + 1;
        local_f08 = uVar18;
        uStack_f00 = uVar19;
        local_ee8 = uVar20;
        uStack_ee0 = uVar21;
        local_ec8 = uVar22;
        uStack_ec0 = uVar23;
        local_ea8 = uVar24;
        uStack_ea0 = uVar25;
        local_e88 = uVar48;
        uStack_e80 = uVar49;
        local_e78 = uVar15;
        uStack_e70 = uVar16;
        local_e68 = uVar50;
        uStack_e60 = uVar51;
        local_e58 = uVar13;
        uStack_e50 = uVar14;
        local_e48 = uVar52;
        uStack_e40 = uVar53;
        local_e38 = uVar11;
        uStack_e30 = uVar12;
        local_e28 = uVar54;
        uStack_e20 = uVar55;
        local_e18 = uVar9;
        uStack_e10 = uVar10;
        local_e08 = uVar56;
        uStack_e00 = uVar57;
        local_de8 = uVar58;
        uStack_de0 = uVar59;
        local_dc8 = uVar60;
        uStack_dc0 = uVar61;
        local_da8 = uVar62;
        uStack_da0 = uVar63;
        local_d88 = uVar64;
        uStack_d80 = uVar65;
        local_d78 = uVar7;
        uStack_d70 = uVar8;
        local_d68 = uVar66;
        uStack_d60 = uVar67;
        local_d58 = uVar5;
        uStack_d50 = uVar6;
        local_d48 = uVar68;
        uStack_d40 = uVar69;
        local_d38 = uVar3;
        uStack_d30 = uVar4;
        local_d28 = uVar70;
        uStack_d20 = uVar71;
        local_d18 = uVar1;
        uStack_d10 = uVar2;
        local_ad8 = local_1538;
        uStack_ad0 = lStack_1530;
        local_ab8 = local_1528;
        uStack_ab0 = lStack_1520;
        local_a98 = local_14e8;
        uStack_a90 = lStack_14e0;
        local_a18 = local_1558;
        uStack_a10 = uStack_1550;
        local_a08 = local_1538;
        lStack_a00 = lStack_1530;
        local_9f8 = local_1548;
        uStack_9f0 = uStack_1540;
        local_9e8 = local_1528;
        lStack_9e0 = lStack_1520;
        local_9d8 = local_14f8;
        uStack_9d0 = uStack_14f0;
        local_9c8 = local_14e8;
        lStack_9c0 = lStack_14e0;
        local_978 = local_1558;
        uStack_970 = uStack_1550;
        local_968 = local_1538;
        lStack_960 = lStack_1530;
        local_958 = local_1548;
        uStack_950 = uStack_1540;
        local_948 = local_1528;
        lStack_940 = lStack_1520;
        local_938 = local_14f8;
        uStack_930 = uStack_14f0;
        local_928 = local_14e8;
        lStack_920 = lStack_14e0;
        local_898 = local_1598;
        uStack_890 = uStack_1590;
        local_888 = local_1518;
        uStack_880 = uStack_1510;
        local_878 = local_1588;
        uStack_870 = uStack_1580;
        local_868 = local_1518;
        uStack_860 = uStack_1510;
        local_858 = local_1578;
        uStack_850 = uStack_1570;
        local_848 = local_1518;
        uStack_840 = uStack_1510;
        local_838 = local_1568;
        uStack_830 = uStack_1560;
        local_828 = local_1518;
        uStack_820 = uStack_1510;
        local_818 = local_1598;
        uStack_810 = uStack_1590;
        local_808 = local_1508;
        uStack_800 = uStack_1500;
        local_7f8 = local_1588;
        uStack_7f0 = uStack_1580;
        local_7e8 = local_1508;
        uStack_7e0 = uStack_1500;
        local_7d8 = local_1578;
        uStack_7d0 = uStack_1570;
        local_7c8 = local_1508;
        uStack_7c0 = uStack_1500;
        local_7b8 = local_1568;
        uStack_7b0 = uStack_1560;
        local_7a8 = local_1508;
        uStack_7a0 = uStack_1500;
        local_718 = local_1598;
        uStack_710 = uStack_1590;
        local_708 = local_1518;
        uStack_700 = uStack_1510;
        local_6f8 = local_1588;
        uStack_6f0 = uStack_1580;
        local_6e8 = local_1518;
        uStack_6e0 = uStack_1510;
        local_6d8 = local_1578;
        uStack_6d0 = uStack_1570;
        local_6c8 = local_1518;
        uStack_6c0 = uStack_1510;
        local_6b8 = local_1568;
        uStack_6b0 = uStack_1560;
        local_6a8 = local_1518;
        uStack_6a0 = uStack_1510;
        local_698 = local_1598;
        uStack_690 = uStack_1590;
        local_688 = local_1508;
        uStack_680 = uStack_1500;
        local_678 = local_1588;
        uStack_670 = uStack_1580;
        local_668 = local_1508;
        uStack_660 = uStack_1500;
        local_658 = local_1578;
        uStack_650 = uStack_1570;
        local_648 = local_1508;
        uStack_640 = uStack_1500;
        local_638 = local_1568;
        uStack_630 = uStack_1560;
        local_628 = local_1508;
        uStack_620 = uStack_1500;
        local_598 = local_1c48;
        local_588 = local_1688;
        uStack_580 = uStack_1680;
        local_578 = local_1c28;
        local_568 = local_1668;
        uStack_560 = uStack_1660;
        local_558 = local_1c08;
        local_548 = local_1648;
        uStack_540 = uStack_1640;
        local_538 = local_1be8;
        local_528 = local_1628;
        uStack_520 = uStack_1620;
        local_518 = local_1bc8;
        local_508 = local_1608;
        uStack_500 = uStack_1600;
        local_4f8 = local_1ba8;
        local_4e8 = local_15e8;
        uStack_4e0 = uStack_15e0;
        local_4d8 = local_1b88;
        local_4c8 = local_15c8;
        uStack_4c0 = uStack_15c0;
        local_4b8 = local_1b68;
        local_4a8 = local_15a8;
        uStack_4a0 = uStack_15a0;
        uStack_410 = uStack_1c40;
        local_408 = local_1688;
        uStack_400 = uStack_1680;
        uStack_3f0 = uStack_1c20;
        local_3e8 = local_1668;
        uStack_3e0 = uStack_1660;
        uStack_3d0 = uStack_1c00;
        local_3c8 = local_1648;
        uStack_3c0 = uStack_1640;
        uStack_3b0 = uStack_1be0;
        local_3a8 = local_1628;
        uStack_3a0 = uStack_1620;
        uStack_390 = uStack_1bc0;
        local_388 = local_1608;
        uStack_380 = uStack_1600;
        uStack_370 = uStack_1ba0;
        local_368 = local_15e8;
        uStack_360 = uStack_15e0;
        uStack_350 = uStack_1b80;
        local_348 = local_15c8;
        uStack_340 = uStack_15c0;
        uStack_330 = uStack_1b60;
        local_328 = local_15a8;
        uStack_320 = uStack_15a0;
      }
      local_268 = local_1458;
      uStack_260 = uStack_1450;
      local_278 = local_1468;
      uStack_270 = uStack_1460;
      local_16a8 = CONCAT44((int)local_d38,(int)local_d18);
      uStack_16a0 = CONCAT44(local_d38._4_4_,local_d18._4_4_);
      local_288 = local_1478;
      uStack_280 = uStack_1470;
      local_298 = local_1488;
      uStack_290 = uStack_1480;
      local_16b8 = CONCAT44((int)local_d78,(int)local_d58);
      uStack_16b0 = CONCAT44(local_d78._4_4_,local_d58._4_4_);
      local_1a8 = local_1458;
      uStack_1a0 = uStack_1450;
      local_1b8 = local_1468;
      uStack_1b0 = uStack_1460;
      local_16c8 = CONCAT44((int)uStack_d30,(int)uStack_d10);
      uStack_16c0 = CONCAT44(uStack_d30._4_4_,uStack_d10._4_4_);
      local_1c8 = local_1478;
      uStack_1c0 = uStack_1470;
      local_1d8 = local_1488;
      uStack_1d0 = uStack_1480;
      local_16d8 = CONCAT44((int)uStack_d70,(int)uStack_d50);
      uStack_16d0 = CONCAT44(uStack_d70._4_4_,uStack_d50._4_4_);
      iStack_1c = local_d38._4_4_;
      iStack_2c = local_d78._4_4_;
      local_18 = CONCAT44(local_18._4_4_,(undefined4)local_1698);
      _local_28 = CONCAT44((int)local_d38,(int)local_d18);
      uStack_1460 = CONCAT44(local_d38._4_4_,iStack_20);
      iStack_3c = uStack_d30._4_4_;
      iStack_4c = uStack_d70._4_4_;
      _local_38 = CONCAT44((int)local_d78,(int)local_d58);
      _local_48 = CONCAT44((int)uStack_d30,(int)uStack_d10);
      uStack_1480 = CONCAT44(uStack_d30._4_4_,iStack_40);
      local_2a8 = local_1498;
      uStack_2a0 = uStack_1490;
      local_2b8 = local_14a8;
      uStack_2b0 = uStack_14a0;
      local_16e8 = CONCAT44((int)local_e38,(int)local_e18);
      uStack_16e0 = CONCAT44(local_e38._4_4_,local_e18._4_4_);
      local_2c8 = local_14b8;
      uStack_2c0 = uStack_14b0;
      local_2d8 = local_14c8;
      uStack_2d0 = uStack_14c0;
      local_16f8 = CONCAT44((int)local_e78,(int)local_e58);
      uStack_16f0 = CONCAT44(local_e78._4_4_,local_e58._4_4_);
      local_1e8 = local_1498;
      uStack_1e0 = uStack_1490;
      local_1f8 = local_14a8;
      uStack_1f0 = uStack_14a0;
      local_1708 = CONCAT44((int)uStack_e30,(int)uStack_e10);
      uStack_1700 = CONCAT44(uStack_e30._4_4_,uStack_e10._4_4_);
      local_208 = local_14b8;
      uStack_200 = uStack_14b0;
      local_218 = local_14c8;
      uStack_210 = uStack_14c0;
      local_1718 = CONCAT44((int)uStack_e70,(int)uStack_e50);
      uStack_1710 = CONCAT44(uStack_e70._4_4_,uStack_e50._4_4_);
      iStack_5c = local_e38._4_4_;
      iStack_6c = local_e78._4_4_;
      _local_58 = CONCAT44((int)uStack_d70,(int)uStack_d50);
      _local_68 = CONCAT44((int)local_e38,(int)local_e18);
      uStack_14a0 = CONCAT44(local_e38._4_4_,iStack_60);
      iStack_7c = uStack_e30._4_4_;
      iStack_8c = uStack_e70._4_4_;
      _local_78 = CONCAT44((int)local_e78,(int)local_e58);
      _local_88 = CONCAT44((int)uStack_e30,(int)uStack_e10);
      uStack_14c0 = CONCAT44(uStack_e30._4_4_,iStack_80);
      local_f28 = (int)local_1ea8;
      iStack_f24 = (int)((ulong)local_1ea8 >> 0x20);
      local_1458 = CONCAT44((int)local_d38 + iStack_f24,(int)local_d18 + local_f28);
      uStack_1450 = CONCAT44((int)local_d78 + local_d38._4_4_,(int)local_d58 + iStack_20);
      local_f48 = (int)local_1ec8;
      iStack_f44 = (int)((ulong)local_1ec8 >> 0x20);
      local_1478 = CONCAT44((int)uStack_d30 + iStack_f44,(int)uStack_d10 + local_f48);
      uStack_1470 = CONCAT44((int)uStack_d70 + uStack_d30._4_4_,(int)uStack_d50 + iStack_40);
      local_f68 = (int)local_1f28;
      iStack_f64 = (int)((ulong)local_1f28 >> 0x20);
      local_1498 = CONCAT44((int)local_e38 + iStack_f64,(int)local_e18 + local_f68);
      uStack_1490 = CONCAT44((int)local_e78 + local_e38._4_4_,(int)local_e58 + iStack_60);
      local_f88 = (int)local_1f48;
      iStack_f84 = (int)((ulong)local_1f48 >> 0x20);
      local_14b8 = CONCAT44((int)uStack_e30 + iStack_f84,(int)uStack_e10 + local_f88);
      uStack_14b0 = CONCAT44((int)uStack_e70 + uStack_e30._4_4_,(int)uStack_e50 + iStack_80);
      local_f98 = local_1458;
      uStack_f90 = uStack_1450;
      local_fa8 = local_1478;
      uStack_fa0 = uStack_1470;
      local_1458 = CONCAT44((int)local_d38 + iStack_f24 + (int)uStack_d30 + iStack_f44,
                            (int)local_d18 + local_f28 + (int)uStack_d10 + local_f48);
      uStack_1450 = CONCAT44((int)local_d78 + local_d38._4_4_ + (int)uStack_d70 + uStack_d30._4_4_,
                             (int)local_d58 + iStack_20 + (int)uStack_d50 + iStack_40);
      local_fb8 = local_1498;
      uStack_fb0 = uStack_1490;
      local_fc8 = local_14b8;
      uStack_fc0 = uStack_14b0;
      local_1498 = CONCAT44((int)local_e38 + iStack_f64 + (int)uStack_e30 + iStack_f84,
                            (int)local_e18 + local_f68 + (int)uStack_e10 + local_f88);
      uStack_1490 = CONCAT44((int)local_e78 + local_e38._4_4_ + (int)uStack_e70 + uStack_e30._4_4_,
                             (int)local_e58 + iStack_60 + (int)uStack_e50 + iStack_80);
      local_c80 = local_1348;
      local_c98 = local_1458;
      uStack_c90 = uStack_1450;
      *(undefined8 *)local_1348 = local_1458;
      *(undefined8 *)(local_1348 + 2) = uStack_1450;
      local_ca0 = local_1348 + 4;
      local_cb8 = local_1498;
      uStack_cb0 = uStack_1490;
      *(undefined8 *)local_ca0 = local_1498;
      *(undefined8 *)(local_1348 + 6) = uStack_1490;
      local_1348 = local_1348 + 8;
      uStack_f80 = uStack_14c0;
      local_f78 = local_1708;
      uStack_f70 = local_1718;
      uStack_f60 = uStack_14a0;
      local_f58 = local_16e8;
      uStack_f50 = local_16f8;
      uStack_f40 = uStack_1480;
      local_f38 = local_16c8;
      uStack_f30 = local_16d8;
      uStack_f20 = uStack_1460;
      local_f18 = local_16a8;
      uStack_f10 = local_16b8;
      local_e78 = uVar1;
      uStack_e70 = uVar2;
      local_e58 = uVar3;
      uStack_e50 = uVar4;
      local_e38 = uVar5;
      uStack_e30 = uVar6;
      local_e18 = uVar7;
      uStack_e10 = uVar8;
      local_d78 = uVar9;
      uStack_d70 = uVar10;
      local_d58 = uVar11;
      uStack_d50 = uVar12;
      local_d38 = uVar13;
      uStack_d30 = uVar14;
      local_d18 = uVar15;
      uStack_d10 = uVar16;
      local_158 = local_1718;
      uStack_150 = uStack_1710;
      local_148 = local_1708;
      uStack_140 = uStack_1700;
      local_138 = local_16f8;
      uStack_130 = uStack_16f0;
      local_128 = local_16e8;
      uStack_120 = uStack_16e0;
      local_118 = local_16d8;
      uStack_110 = uStack_16d0;
      local_108 = local_16c8;
      uStack_100 = uStack_16c0;
      local_f8 = local_16b8;
      uStack_f0 = uStack_16b0;
      local_e8 = local_16a8;
      uStack_e0 = uStack_16a0;
      local_98 = local_1718;
    }
    for (; iVar113 = (int)((ulong)in_stack_ffffffffffffdd80 >> 0x20), local_1394 < local_114c;
        local_1394 = local_1394 + 1) {
      Mat::channel(in_stack_ffffffffffffdd88,iVar113);
      plVar92 = (long *)Mat::operator_cast_to_signed_char_(&local_1768);
      Mat::~Mat((Mat *)0x1ddd62);
      local_1720 = plVar92;
      Mat::channel(in_stack_ffffffffffffdd88,iVar113);
      plVar92 = (long *)Mat::operator_cast_to_signed_char_(&local_17b8);
      Mat::~Mat((Mat *)0x1dddba);
      local_bf8 = 0;
      uStack_bf0 = 0;
      local_17d8 = 0;
      uStack_17d0 = 0;
      local_c08 = 0;
      uStack_c00 = 0;
      local_17e8 = 0;
      uStack_17e0 = 0;
      local_c18 = 0;
      uStack_c10 = 0;
      local_17f8 = 0;
      uStack_17f0 = 0;
      local_c28 = 0;
      uStack_c20 = 0;
      local_1808 = 0;
      uStack_1800 = 0;
      local_180c = 0;
      local_1770 = plVar92;
      while( true ) {
        uVar8 = uStack_fd0;
        uVar7 = local_fd8;
        uVar6 = uStack_ff0;
        uVar5 = local_ff8;
        uVar4 = uStack_1010;
        uVar3 = local_1018;
        uVar2 = uStack_1030;
        uVar1 = local_1038;
        local_fd8._0_4_ = (int)local_17d8;
        local_fd8._4_4_ = (int)((ulong)local_17d8 >> 0x20);
        uStack_fd0._0_4_ = (int)uStack_17d0;
        uStack_fd0._4_4_ = (int)((ulong)uStack_17d0 >> 0x20);
        local_ff8._0_4_ = (int)local_17e8;
        local_ff8._4_4_ = (int)((ulong)local_17e8 >> 0x20);
        uStack_ff0._0_4_ = (int)uStack_17e0;
        uStack_ff0._4_4_ = (int)((ulong)uStack_17e0 >> 0x20);
        local_1018._0_4_ = (int)local_17f8;
        local_1018._4_4_ = (int)((ulong)local_17f8 >> 0x20);
        uStack_1010._0_4_ = (int)uStack_17f0;
        uStack_1010._4_4_ = (int)((ulong)uStack_17f0 >> 0x20);
        local_1038._0_4_ = (int)local_1808;
        local_1038._4_4_ = (int)((ulong)local_1808 >> 0x20);
        uStack_1030._0_4_ = (int)uStack_1800;
        uStack_1030._4_4_ = (int)((ulong)uStack_1800 >> 0x20);
        if (local_1154 * local_1150 <= local_180c) break;
        local_8 = local_1720;
        local_a28 = *local_1720;
        uStack_10 = 0;
        local_c38 = 0;
        uStack_c30 = 0;
        local_ae8 = 0;
        uStack_ae0 = 0;
        uStack_af0 = 0;
        local_af8._0_1_ = (char)local_a28;
        local_af8._1_1_ = (char)((ulong)local_a28 >> 8);
        local_af8._2_1_ = (char)((ulong)local_a28 >> 0x10);
        local_af8._3_1_ = (char)((ulong)local_a28 >> 0x18);
        local_af8._4_1_ = (char)((ulong)local_a28 >> 0x20);
        local_af8._5_1_ = (char)((ulong)local_a28 >> 0x28);
        local_af8._6_1_ = (char)((ulong)local_a28 >> 0x30);
        local_af8._7_1_ = (undefined1)((ulong)local_a28 >> 0x38);
        local_a38 = CONCAT17(-(local_a28 < 0),
                             CONCAT16(-(local_af8._6_1_ < '\0'),
                                      CONCAT15(-(local_af8._5_1_ < '\0'),
                                               CONCAT14(-(local_af8._4_1_ < '\0'),
                                                        CONCAT13(-(local_af8._3_1_ < '\0'),
                                                                 CONCAT12(-(local_af8._2_1_ < '\0'),
                                                                          CONCAT11(-(local_af8._1_1_
                                                                                    < '\0'),-((char)
                                                  local_af8 < '\0'))))))));
        uStack_a30 = 0;
        uStack_a20 = 0;
        sVar98 = CONCAT11(-((char)local_af8 < '\0'),(char)local_af8);
        uVar44 = CONCAT13(-(local_af8._1_1_ < '\0'),CONCAT12(local_af8._1_1_,sVar98));
        uVar45 = CONCAT15(-(local_af8._2_1_ < '\0'),CONCAT14(local_af8._2_1_,uVar44));
        local_908 = CONCAT17(-(local_af8._3_1_ < '\0'),CONCAT16(local_af8._3_1_,uVar45));
        sVar112 = CONCAT11(-(local_af8._4_1_ < '\0'),local_af8._4_1_);
        uVar46 = CONCAT13(-(local_af8._5_1_ < '\0'),CONCAT12(local_af8._5_1_,sVar112));
        uVar47 = CONCAT15(-(local_af8._6_1_ < '\0'),CONCAT14(local_af8._6_1_,uVar46));
        uStack_900 = CONCAT17(-(local_a28 < 0),CONCAT16(local_af8._7_1_,uVar47));
        local_d00 = local_1770;
        local_a48 = *local_1770;
        lStack_a40 = local_1770[1];
        local_d08 = local_1770 + 2;
        local_a68 = *local_d08;
        lStack_a60 = local_1770[3];
        local_c48 = 0;
        uStack_c40 = 0;
        local_b08 = 0;
        uStack_b00 = 0;
        local_b18._0_1_ = (char)local_a48;
        local_b18._1_1_ = (char)((ulong)local_a48 >> 8);
        local_b18._2_1_ = (char)((ulong)local_a48 >> 0x10);
        local_b18._3_1_ = (char)((ulong)local_a48 >> 0x18);
        local_b18._4_1_ = (char)((ulong)local_a48 >> 0x20);
        local_b18._5_1_ = (char)((ulong)local_a48 >> 0x28);
        local_b18._6_1_ = (char)((ulong)local_a48 >> 0x30);
        local_b18._7_1_ = (undefined1)((ulong)local_a48 >> 0x38);
        uStack_b10._0_1_ = (char)lStack_a40;
        uStack_b10._1_1_ = (char)((ulong)lStack_a40 >> 8);
        uStack_b10._2_1_ = (char)((ulong)lStack_a40 >> 0x10);
        uStack_b10._3_1_ = (char)((ulong)lStack_a40 >> 0x18);
        uStack_b10._4_1_ = (char)((ulong)lStack_a40 >> 0x20);
        uStack_b10._5_1_ = (char)((ulong)lStack_a40 >> 0x28);
        uStack_b10._6_1_ = (char)((ulong)lStack_a40 >> 0x30);
        uStack_b10._7_1_ = (undefined1)((ulong)lStack_a40 >> 0x38);
        local_a58 = CONCAT17(-(local_a48 < 0),
                             CONCAT16(-(local_b18._6_1_ < '\0'),
                                      CONCAT15(-(local_b18._5_1_ < '\0'),
                                               CONCAT14(-(local_b18._4_1_ < '\0'),
                                                        CONCAT13(-(local_b18._3_1_ < '\0'),
                                                                 CONCAT12(-(local_b18._2_1_ < '\0'),
                                                                          CONCAT11(-(local_b18._1_1_
                                                                                    < '\0'),-((char)
                                                  local_b18 < '\0'))))))));
        uStack_a50 = CONCAT17(-(lStack_a40 < 0),
                              CONCAT16(-(uStack_b10._6_1_ < '\0'),
                                       CONCAT15(-(uStack_b10._5_1_ < '\0'),
                                                CONCAT14(-(uStack_b10._4_1_ < '\0'),
                                                         CONCAT13(-(uStack_b10._3_1_ < '\0'),
                                                                  CONCAT12(-(uStack_b10._2_1_ < '\0'
                                                                            ),CONCAT11(-(uStack_b10.
                                                                                         _1_1_ < 
                                                  '\0'),-((char)uStack_b10 < '\0'))))))));
        local_c58 = 0;
        uStack_c50 = 0;
        local_b28 = 0;
        uStack_b20 = 0;
        local_b38._0_1_ = (char)local_a68;
        local_b38._1_1_ = (char)((ulong)local_a68 >> 8);
        local_b38._2_1_ = (char)((ulong)local_a68 >> 0x10);
        local_b38._3_1_ = (char)((ulong)local_a68 >> 0x18);
        local_b38._4_1_ = (char)((ulong)local_a68 >> 0x20);
        local_b38._5_1_ = (char)((ulong)local_a68 >> 0x28);
        local_b38._6_1_ = (char)((ulong)local_a68 >> 0x30);
        local_b38._7_1_ = (undefined1)((ulong)local_a68 >> 0x38);
        uStack_b30._0_1_ = (char)lStack_a60;
        uStack_b30._1_1_ = (char)((ulong)lStack_a60 >> 8);
        uStack_b30._2_1_ = (char)((ulong)lStack_a60 >> 0x10);
        uStack_b30._3_1_ = (char)((ulong)lStack_a60 >> 0x18);
        uStack_b30._4_1_ = (char)((ulong)lStack_a60 >> 0x20);
        uStack_b30._5_1_ = (char)((ulong)lStack_a60 >> 0x28);
        uStack_b30._6_1_ = (char)((ulong)lStack_a60 >> 0x30);
        uStack_b30._7_1_ = (undefined1)((ulong)lStack_a60 >> 0x38);
        local_a78 = CONCAT17(-(local_a68 < 0),
                             CONCAT16(-(local_b38._6_1_ < '\0'),
                                      CONCAT15(-(local_b38._5_1_ < '\0'),
                                               CONCAT14(-(local_b38._4_1_ < '\0'),
                                                        CONCAT13(-(local_b38._3_1_ < '\0'),
                                                                 CONCAT12(-(local_b38._2_1_ < '\0'),
                                                                          CONCAT11(-(local_b38._1_1_
                                                                                    < '\0'),-((char)
                                                  local_b38 < '\0'))))))));
        uStack_a70 = CONCAT17(-(lStack_a60 < 0),
                              CONCAT16(-(uStack_b30._6_1_ < '\0'),
                                       CONCAT15(-(uStack_b30._5_1_ < '\0'),
                                                CONCAT14(-(uStack_b30._4_1_ < '\0'),
                                                         CONCAT13(-(uStack_b30._3_1_ < '\0'),
                                                                  CONCAT12(-(uStack_b30._2_1_ < '\0'
                                                                            ),CONCAT11(-(uStack_b30.
                                                                                         _1_1_ < 
                                                  '\0'),-((char)uStack_b30 < '\0'))))))));
        sVar95 = CONCAT11(-((char)local_b18 < '\0'),(char)local_b18);
        uVar40 = CONCAT13(-(local_b18._1_1_ < '\0'),CONCAT12(local_b18._1_1_,sVar95));
        uVar41 = CONCAT15(-(local_b18._2_1_ < '\0'),CONCAT14(local_b18._2_1_,uVar40));
        local_738 = CONCAT17(-(local_b18._3_1_ < '\0'),CONCAT16(local_b18._3_1_,uVar41));
        sVar109 = CONCAT11(-(local_b18._4_1_ < '\0'),local_b18._4_1_);
        uVar42 = CONCAT13(-(local_b18._5_1_ < '\0'),CONCAT12(local_b18._5_1_,sVar109));
        uVar43 = CONCAT15(-(local_b18._6_1_ < '\0'),CONCAT14(local_b18._6_1_,uVar42));
        uStack_730 = CONCAT17(-(local_a48 < 0),CONCAT16(local_b18._7_1_,uVar43));
        sVar96 = CONCAT11(-((char)uStack_b10 < '\0'),(char)uStack_b10);
        uVar36 = CONCAT13(-(uStack_b10._1_1_ < '\0'),CONCAT12(uStack_b10._1_1_,sVar96));
        uVar37 = CONCAT15(-(uStack_b10._2_1_ < '\0'),CONCAT14(uStack_b10._2_1_,uVar36));
        local_758 = CONCAT17(-(uStack_b10._3_1_ < '\0'),CONCAT16(uStack_b10._3_1_,uVar37));
        sVar110 = CONCAT11(-(uStack_b10._4_1_ < '\0'),uStack_b10._4_1_);
        uVar38 = CONCAT13(-(uStack_b10._5_1_ < '\0'),CONCAT12(uStack_b10._5_1_,sVar110));
        uVar39 = CONCAT15(-(uStack_b10._6_1_ < '\0'),CONCAT14(uStack_b10._6_1_,uVar38));
        uStack_750 = CONCAT17(-(lStack_a40 < 0),CONCAT16(uStack_b10._7_1_,uVar39));
        sVar97 = CONCAT11(-((char)local_b38 < '\0'),(char)local_b38);
        uVar32 = CONCAT13(-(local_b38._1_1_ < '\0'),CONCAT12(local_b38._1_1_,sVar97));
        uVar33 = CONCAT15(-(local_b38._2_1_ < '\0'),CONCAT14(local_b38._2_1_,uVar32));
        local_778 = CONCAT17(-(local_b38._3_1_ < '\0'),CONCAT16(local_b38._3_1_,uVar33));
        sVar111 = CONCAT11(-(local_b38._4_1_ < '\0'),local_b38._4_1_);
        uVar34 = CONCAT13(-(local_b38._5_1_ < '\0'),CONCAT12(local_b38._5_1_,sVar111));
        uVar35 = CONCAT15(-(local_b38._6_1_ < '\0'),CONCAT14(local_b38._6_1_,uVar34));
        uStack_770 = CONCAT17(-(local_a68 < 0),CONCAT16(local_b38._7_1_,uVar35));
        sVar26 = CONCAT11(-((char)uStack_b30 < '\0'),(char)uStack_b30);
        uVar27 = CONCAT13(-(uStack_b30._1_1_ < '\0'),CONCAT12(uStack_b30._1_1_,sVar26));
        uVar28 = CONCAT15(-(uStack_b30._2_1_ < '\0'),CONCAT14(uStack_b30._2_1_,uVar27));
        local_798 = CONCAT17(-(uStack_b30._3_1_ < '\0'),CONCAT16(uStack_b30._3_1_,uVar28));
        sVar29 = CONCAT11(-(uStack_b30._4_1_ < '\0'),uStack_b30._4_1_);
        uVar30 = CONCAT13(-(uStack_b30._5_1_ < '\0'),CONCAT12(uStack_b30._5_1_,sVar29));
        uVar31 = CONCAT15(-(uStack_b30._6_1_ < '\0'),CONCAT14(uStack_b30._6_1_,uVar30));
        uStack_790 = CONCAT17(-(lStack_a60 < 0),CONCAT16(uStack_b30._7_1_,uVar31));
        local_8a8._2_2_ = (short)((uint)uVar44 >> 0x10);
        local_8a8._4_2_ = (short)((uint6)uVar45 >> 0x20);
        local_8a8._6_2_ = (short)((ulong)local_908 >> 0x30);
        uStack_8a0._2_2_ = (short)((uint)uVar46 >> 0x10);
        uStack_8a0._4_2_ = (short)((uint6)uVar47 >> 0x20);
        uStack_8a0._6_2_ = (short)((ulong)uStack_900 >> 0x30);
        local_8b8._2_2_ = (short)((uint)uVar40 >> 0x10);
        local_8b8._4_2_ = (short)((uint6)uVar41 >> 0x20);
        local_8b8._6_2_ = (short)((ulong)local_738 >> 0x30);
        uStack_8b0._2_2_ = (short)((uint)uVar42 >> 0x10);
        uStack_8b0._4_2_ = (short)((uint6)uVar43 >> 0x20);
        uStack_8b0._6_2_ = (short)((ulong)uStack_730 >> 0x30);
        sVar95 = sVar98 * sVar95;
        sVar109 = sVar112 * sVar109;
        local_5a8 = CONCAT26(local_8a8._6_2_ * local_8b8._6_2_,
                             CONCAT24(local_8a8._4_2_ * local_8b8._4_2_,
                                      CONCAT22(local_8a8._2_2_ * local_8b8._2_2_,sVar95)));
        uStack_5a0 = CONCAT26(uStack_8a0._6_2_ * uStack_8b0._6_2_,
                              CONCAT24(uStack_8a0._4_2_ * uStack_8b0._4_2_,
                                       CONCAT22(uStack_8a0._2_2_ * uStack_8b0._2_2_,sVar109)));
        auVar85._8_8_ = uStack_900;
        auVar85._0_8_ = local_908;
        auVar84._8_8_ = uStack_730;
        auVar84._0_8_ = local_738;
        auVar106 = pmulhw(auVar85,auVar84);
        local_20b8 = auVar106._0_8_;
        uStack_20b0 = auVar106._8_8_;
        local_8d8._2_2_ = (short)((uint)uVar36 >> 0x10);
        local_8d8._4_2_ = (short)((uint6)uVar37 >> 0x20);
        local_8d8._6_2_ = (short)((ulong)local_758 >> 0x30);
        uStack_8d0._2_2_ = (short)((uint)uVar38 >> 0x10);
        uStack_8d0._4_2_ = (short)((uint6)uVar39 >> 0x20);
        uStack_8d0._6_2_ = (short)((ulong)uStack_750 >> 0x30);
        sVar96 = sVar98 * sVar96;
        sVar110 = sVar112 * sVar110;
        local_5c8 = CONCAT26(local_8a8._6_2_ * local_8d8._6_2_,
                             CONCAT24(local_8a8._4_2_ * local_8d8._4_2_,
                                      CONCAT22(local_8a8._2_2_ * local_8d8._2_2_,sVar96)));
        uStack_5c0 = CONCAT26(uStack_8a0._6_2_ * uStack_8d0._6_2_,
                              CONCAT24(uStack_8a0._4_2_ * uStack_8d0._4_2_,
                                       CONCAT22(uStack_8a0._2_2_ * uStack_8d0._2_2_,sVar110)));
        auVar83._8_8_ = uStack_900;
        auVar83._0_8_ = local_908;
        auVar82._8_8_ = uStack_750;
        auVar82._0_8_ = local_758;
        auVar107 = pmulhw(auVar83,auVar82);
        local_20d8 = auVar107._0_8_;
        uStack_20d0 = auVar107._8_8_;
        local_8f8._2_2_ = (short)((uint)uVar32 >> 0x10);
        local_8f8._4_2_ = (short)((uint6)uVar33 >> 0x20);
        local_8f8._6_2_ = (short)((ulong)local_778 >> 0x30);
        uStack_8f0._2_2_ = (short)((uint)uVar34 >> 0x10);
        uStack_8f0._4_2_ = (short)((uint6)uVar35 >> 0x20);
        uStack_8f0._6_2_ = (short)((ulong)uStack_770 >> 0x30);
        sVar97 = sVar98 * sVar97;
        sVar111 = sVar112 * sVar111;
        local_5e8 = CONCAT26(local_8a8._6_2_ * local_8f8._6_2_,
                             CONCAT24(local_8a8._4_2_ * local_8f8._4_2_,
                                      CONCAT22(local_8a8._2_2_ * local_8f8._2_2_,sVar97)));
        uStack_5e0 = CONCAT26(uStack_8a0._6_2_ * uStack_8f0._6_2_,
                              CONCAT24(uStack_8a0._4_2_ * uStack_8f0._4_2_,
                                       CONCAT22(uStack_8a0._2_2_ * uStack_8f0._2_2_,sVar111)));
        auVar81._8_8_ = uStack_900;
        auVar81._0_8_ = local_908;
        auVar80._8_8_ = uStack_770;
        auVar80._0_8_ = local_778;
        auVar105 = pmulhw(auVar81,auVar80);
        local_20f8 = auVar105._0_8_;
        uStack_20f0 = auVar105._8_8_;
        local_918._2_2_ = (short)((uint)uVar27 >> 0x10);
        local_918._4_2_ = (short)((uint6)uVar28 >> 0x20);
        local_918._6_2_ = (short)((ulong)local_798 >> 0x30);
        uStack_910._2_2_ = (short)((uint)uVar30 >> 0x10);
        uStack_910._4_2_ = (short)((uint6)uVar31 >> 0x20);
        uStack_910._6_2_ = (short)((ulong)uStack_790 >> 0x30);
        sVar98 = sVar98 * sVar26;
        sVar112 = sVar112 * sVar29;
        local_608 = CONCAT26(local_8a8._6_2_ * local_918._6_2_,
                             CONCAT24(local_8a8._4_2_ * local_918._4_2_,
                                      CONCAT22(local_8a8._2_2_ * local_918._2_2_,sVar98)));
        uStack_600 = CONCAT26(uStack_8a0._6_2_ * uStack_910._6_2_,
                              CONCAT24(uStack_8a0._4_2_ * uStack_910._4_2_,
                                       CONCAT22(uStack_8a0._2_2_ * uStack_910._2_2_,sVar112)));
        auVar79._8_8_ = uStack_900;
        auVar79._0_8_ = local_908;
        auVar78._8_8_ = uStack_790;
        auVar78._0_8_ = local_798;
        auVar108 = pmulhw(auVar79,auVar78);
        local_2118 = auVar108._0_8_;
        local_1928 = local_2118;
        uStack_2110 = auVar108._8_8_;
        uStack_5b0 = uStack_20b0;
        local_5b8._0_2_ = auVar106._0_2_;
        local_5b8._2_2_ = auVar106._2_2_;
        local_5b8._4_2_ = auVar106._4_2_;
        local_5b8._6_2_ = auVar106._6_2_;
        iVar113 = CONCAT22((undefined2)local_5b8,sVar95);
        uVar24 = CONCAT26(local_5b8._2_2_,CONCAT24(local_8a8._2_2_ * local_8b8._2_2_,iVar113));
        iVar17 = CONCAT22(local_5b8._4_2_,local_8a8._4_2_ * local_8b8._4_2_);
        uVar25 = CONCAT26(local_5b8._6_2_,CONCAT24(local_8a8._6_2_ * local_8b8._6_2_,iVar17));
        uVar1 = local_17d8;
        uVar2 = uStack_17d0;
        local_fe8._4_4_ = (int)((ulong)uVar24 >> 0x20);
        uStack_fe0._4_4_ = (int)((ulong)uVar25 >> 0x20);
        local_fd8._0_4_ = (int)local_fd8 + iVar113;
        uStack_fd0._0_4_ = (int)uStack_fd0 + iVar17;
        local_17d8 = CONCAT44(local_fd8._4_4_ + local_fe8._4_4_,(int)local_fd8);
        uStack_17d0 = CONCAT44(uStack_fd0._4_4_ + uStack_fe0._4_4_,(int)uStack_fd0);
        uStack_5d0 = uStack_20d0;
        local_5d8._0_2_ = auVar107._0_2_;
        local_5d8._2_2_ = auVar107._2_2_;
        local_5d8._4_2_ = auVar107._4_2_;
        local_5d8._6_2_ = auVar107._6_2_;
        iVar113 = CONCAT22((undefined2)local_5d8,sVar96);
        uVar22 = CONCAT26(local_5d8._2_2_,CONCAT24(local_8a8._2_2_ * local_8d8._2_2_,iVar113));
        iVar17 = CONCAT22(local_5d8._4_2_,local_8a8._4_2_ * local_8d8._4_2_);
        uVar23 = CONCAT26(local_5d8._6_2_,CONCAT24(local_8a8._6_2_ * local_8d8._6_2_,iVar17));
        uVar3 = local_17e8;
        uVar4 = uStack_17e0;
        local_1008._4_4_ = (int)((ulong)uVar22 >> 0x20);
        uStack_1000._4_4_ = (int)((ulong)uVar23 >> 0x20);
        local_ff8._0_4_ = (int)local_ff8 + iVar113;
        uStack_ff0._0_4_ = (int)uStack_ff0 + iVar17;
        local_17e8 = CONCAT44(local_ff8._4_4_ + local_1008._4_4_,(int)local_ff8);
        uStack_17e0 = CONCAT44(uStack_ff0._4_4_ + uStack_1000._4_4_,(int)uStack_ff0);
        uStack_5f0 = uStack_20f0;
        local_5f8._0_2_ = auVar105._0_2_;
        local_5f8._2_2_ = auVar105._2_2_;
        local_5f8._4_2_ = auVar105._4_2_;
        local_5f8._6_2_ = auVar105._6_2_;
        iVar113 = CONCAT22((undefined2)local_5f8,sVar97);
        uVar20 = CONCAT26(local_5f8._2_2_,CONCAT24(local_8a8._2_2_ * local_8f8._2_2_,iVar113));
        iVar17 = CONCAT22(local_5f8._4_2_,local_8a8._4_2_ * local_8f8._4_2_);
        uVar21 = CONCAT26(local_5f8._6_2_,CONCAT24(local_8a8._6_2_ * local_8f8._6_2_,iVar17));
        uVar5 = local_17f8;
        uVar6 = uStack_17f0;
        local_1028._4_4_ = (int)((ulong)uVar20 >> 0x20);
        uStack_1020._4_4_ = (int)((ulong)uVar21 >> 0x20);
        local_1018._0_4_ = (int)local_1018 + iVar113;
        uStack_1010._0_4_ = (int)uStack_1010 + iVar17;
        local_17f8 = CONCAT44(local_1018._4_4_ + local_1028._4_4_,(int)local_1018);
        uStack_17f0 = CONCAT44(uStack_1010._4_4_ + uStack_1020._4_4_,(int)uStack_1010);
        uStack_610 = uStack_2110;
        local_618._0_2_ = auVar108._0_2_;
        local_618._2_2_ = auVar108._2_2_;
        local_618._4_2_ = auVar108._4_2_;
        local_618._6_2_ = auVar108._6_2_;
        iVar113 = CONCAT22((undefined2)local_618,sVar98);
        uVar18 = CONCAT26(local_618._2_2_,CONCAT24(local_8a8._2_2_ * local_918._2_2_,iVar113));
        iVar17 = CONCAT22(local_618._4_2_,local_8a8._4_2_ * local_918._4_2_);
        uVar19 = CONCAT26(local_618._6_2_,CONCAT24(local_8a8._6_2_ * local_918._6_2_,iVar17));
        uVar7 = local_1808;
        uVar8 = uStack_1800;
        local_1048._4_4_ = (int)((ulong)uVar18 >> 0x20);
        uStack_1040._4_4_ = (int)((ulong)uVar19 >> 0x20);
        local_1038._0_4_ = (int)local_1038 + iVar113;
        uStack_1030._0_4_ = (int)uStack_1030 + iVar17;
        local_1808 = CONCAT44(local_1038._4_4_ + local_1048._4_4_,(int)local_1038);
        uStack_1800 = CONCAT44(uStack_1030._4_4_ + uStack_1040._4_4_,(int)uStack_1030);
        local_438 = local_20b8;
        uStack_430._0_2_ = auVar106._8_2_;
        uStack_430._2_2_ = auVar106._10_2_;
        uStack_430._4_2_ = auVar106._12_2_;
        uStack_430._6_2_ = auVar106._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_430,sVar109);
        uVar15 = CONCAT26(uStack_430._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_8b0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_430._4_2_,uStack_8a0._4_2_ * uStack_8b0._4_2_);
        uVar16 = CONCAT26(uStack_430._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_8b0._6_2_,iVar17));
        local_1058 = local_17d8;
        uStack_1050 = uStack_17d0;
        local_1068._4_4_ = (int)((ulong)uVar15 >> 0x20);
        uStack_1060._4_4_ = (int)((ulong)uVar16 >> 0x20);
        local_17d8 = CONCAT44(local_fd8._4_4_ + local_fe8._4_4_ + local_1068._4_4_,
                              (int)local_fd8 + iVar113);
        uStack_17d0 = CONCAT44(uStack_fd0._4_4_ + uStack_fe0._4_4_ + uStack_1060._4_4_,
                               (int)uStack_fd0 + iVar17);
        local_458 = local_20d8;
        uStack_450._0_2_ = auVar107._8_2_;
        uStack_450._2_2_ = auVar107._10_2_;
        uStack_450._4_2_ = auVar107._12_2_;
        uStack_450._6_2_ = auVar107._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_450,sVar110);
        uVar13 = CONCAT26(uStack_450._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_8d0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_450._4_2_,uStack_8a0._4_2_ * uStack_8d0._4_2_);
        uVar14 = CONCAT26(uStack_450._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_8d0._6_2_,iVar17));
        local_1078 = local_17e8;
        uStack_1070 = uStack_17e0;
        local_1088._4_4_ = (int)((ulong)uVar13 >> 0x20);
        uStack_1080._4_4_ = (int)((ulong)uVar14 >> 0x20);
        local_17e8 = CONCAT44(local_ff8._4_4_ + local_1008._4_4_ + local_1088._4_4_,
                              (int)local_ff8 + iVar113);
        uStack_17e0 = CONCAT44(uStack_ff0._4_4_ + uStack_1000._4_4_ + uStack_1080._4_4_,
                               (int)uStack_ff0 + iVar17);
        local_478 = local_20f8;
        uStack_470._0_2_ = auVar105._8_2_;
        uStack_470._2_2_ = auVar105._10_2_;
        uStack_470._4_2_ = auVar105._12_2_;
        uStack_470._6_2_ = auVar105._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_470,sVar111);
        uVar11 = CONCAT26(uStack_470._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_8f0._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_470._4_2_,uStack_8a0._4_2_ * uStack_8f0._4_2_);
        uVar12 = CONCAT26(uStack_470._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_8f0._6_2_,iVar17));
        local_1098 = local_17f8;
        uStack_1090 = uStack_17f0;
        local_10a8._4_4_ = (int)((ulong)uVar11 >> 0x20);
        uStack_10a0._4_4_ = (int)((ulong)uVar12 >> 0x20);
        local_17f8 = CONCAT44(local_1018._4_4_ + local_1028._4_4_ + local_10a8._4_4_,
                              (int)local_1018 + iVar113);
        uStack_17f0 = CONCAT44(uStack_1010._4_4_ + uStack_1020._4_4_ + uStack_10a0._4_4_,
                               (int)uStack_1010 + iVar17);
        local_498 = local_2118;
        uStack_490._0_2_ = auVar108._8_2_;
        uStack_490._2_2_ = auVar108._10_2_;
        uStack_490._4_2_ = auVar108._12_2_;
        uStack_490._6_2_ = auVar108._14_2_;
        iVar113 = CONCAT22((undefined2)uStack_490,sVar112);
        uVar9 = CONCAT26(uStack_490._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_910._2_2_,iVar113));
        iVar17 = CONCAT22(uStack_490._4_2_,uStack_8a0._4_2_ * uStack_910._4_2_);
        uVar10 = CONCAT26(uStack_490._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_910._6_2_,iVar17));
        local_10b8 = local_1808;
        uStack_10b0 = uStack_1800;
        local_10c8._4_4_ = (int)((ulong)uVar9 >> 0x20);
        uStack_10c0._4_4_ = (int)((ulong)uVar10 >> 0x20);
        local_1808 = CONCAT44(local_1038._4_4_ + local_1048._4_4_ + local_10c8._4_4_,
                              (int)local_1038 + iVar113);
        uStack_1800 = CONCAT44(uStack_1030._4_4_ + uStack_1040._4_4_ + uStack_10c0._4_4_,
                               (int)uStack_1030 + iVar17);
        local_1720 = local_1720 + 1;
        local_1770 = local_1770 + 4;
        local_180c = local_180c + 1;
        local_10c8 = uVar9;
        uStack_10c0 = uVar10;
        local_10a8 = uVar11;
        uStack_10a0 = uVar12;
        local_1088 = uVar13;
        uStack_1080 = uVar14;
        local_1068 = uVar15;
        uStack_1060 = uVar16;
        local_1048 = uVar18;
        uStack_1040 = uVar19;
        local_1038 = uVar7;
        uStack_1030 = uVar8;
        local_1028 = uVar20;
        uStack_1020 = uVar21;
        local_1018 = uVar5;
        uStack_1010 = uVar6;
        local_1008 = uVar22;
        uStack_1000 = uVar23;
        local_ff8 = uVar3;
        uStack_ff0 = uVar4;
        local_fe8 = uVar24;
        uStack_fe0 = uVar25;
        local_fd8 = uVar1;
        uStack_fd0 = uVar2;
        local_b38 = local_a68;
        uStack_b30 = lStack_a60;
        local_b18 = local_a48;
        uStack_b10 = lStack_a40;
        local_af8 = local_a28;
        local_9b8 = local_a78;
        uStack_9b0 = uStack_a70;
        local_9a8 = local_a68;
        lStack_9a0 = lStack_a60;
        local_998 = local_a58;
        uStack_990 = uStack_a50;
        local_988 = local_a48;
        lStack_980 = lStack_a40;
        local_918 = local_798;
        uStack_910 = uStack_790;
        local_8f8 = local_778;
        uStack_8f0 = uStack_770;
        local_8e8 = local_908;
        uStack_8e0 = uStack_900;
        local_8d8 = local_758;
        uStack_8d0 = uStack_750;
        local_8c8 = local_908;
        uStack_8c0 = uStack_900;
        local_8b8 = local_738;
        uStack_8b0 = uStack_730;
        local_8a8 = local_908;
        uStack_8a0 = uStack_900;
        local_788 = local_908;
        uStack_780 = uStack_900;
        local_768 = local_908;
        uStack_760 = uStack_900;
        local_748 = local_908;
        uStack_740 = uStack_900;
        local_728 = local_908;
        uStack_720 = uStack_900;
        local_618 = local_2118;
        local_5f8 = local_20f8;
        local_5d8 = local_20d8;
        local_5b8 = local_20b8;
        uStack_490 = uStack_2110;
        local_488 = local_608;
        uStack_480 = uStack_600;
        uStack_470 = uStack_20f0;
        local_468 = local_5e8;
        uStack_460 = uStack_5e0;
        uStack_450 = uStack_20d0;
        local_448 = local_5c8;
        uStack_440 = uStack_5c0;
        uStack_430 = uStack_20b0;
        local_428 = local_5a8;
        uStack_420 = uStack_5a0;
        local_18 = local_a28;
      }
      local_2e8 = local_17d8;
      uStack_2e0 = uStack_17d0;
      local_2f8 = local_17e8;
      uStack_2f0 = uStack_17e0;
      local_10d8 = CONCAT44((int)local_ff8,(int)local_fd8);
      uStack_160 = CONCAT44(local_ff8._4_4_,local_fd8._4_4_);
      local_308 = local_17f8;
      uStack_300 = uStack_17f0;
      local_318 = local_1808;
      uStack_310 = uStack_1800;
      uStack_10d0 = CONCAT44((int)local_1038,(int)local_1018);
      uStack_170 = CONCAT44(local_1038._4_4_,local_1018._4_4_);
      local_228 = local_17d8;
      uStack_220 = uStack_17d0;
      local_238 = local_17e8;
      uStack_230 = uStack_17e0;
      local_10f8 = CONCAT44((int)uStack_ff0,(int)uStack_fd0);
      uStack_180 = CONCAT44(uStack_ff0._4_4_,uStack_fd0._4_4_);
      local_248 = local_17f8;
      uStack_240 = uStack_17f0;
      local_258 = local_1808;
      uStack_250 = uStack_1800;
      in_stack_ffffffffffffdd80 = (Mat *)CONCAT44((int)uStack_1030,(int)uStack_1010);
      uStack_190 = CONCAT44(uStack_1030._4_4_,uStack_1010._4_4_);
      iStack_9c = local_ff8._4_4_;
      iStack_ac = local_1038._4_4_;
      local_98 = CONCAT44(local_98._4_4_,(undefined4)local_1928);
      _local_a8 = CONCAT44((int)local_ff8,(int)local_fd8);
      uStack_10e0 = CONCAT44(local_ff8._4_4_,iStack_a0);
      iStack_bc = uStack_ff0._4_4_;
      iStack_cc = uStack_1030._4_4_;
      _local_b8 = CONCAT44((int)local_1038,(int)local_1018);
      _local_c8 = CONCAT44((int)uStack_ff0,(int)uStack_fd0);
      uStack_1100 = CONCAT44(uStack_ff0._4_4_,iStack_c0);
      local_10e8 = (int)in_stack_ffffffffffffdd88;
      iStack_10e4 = (int)((ulong)in_stack_ffffffffffffdd88 >> 0x20);
      local_17d8 = CONCAT44((int)local_ff8 + iStack_10e4,(int)local_fd8 + local_10e8);
      uStack_17d0 = CONCAT44((int)local_1038 + local_ff8._4_4_,(int)local_1018 + iStack_a0);
      local_1108 = (int)in_stack_ffffffffffffdd68;
      iStack_1104 = (int)(in_stack_ffffffffffffdd68 >> 0x20);
      local_17f8 = CONCAT44((int)uStack_ff0 + iStack_1104,(int)uStack_fd0 + local_1108);
      uStack_17f0 = CONCAT44((int)uStack_1030 + uStack_ff0._4_4_,(int)uStack_1010 + iStack_c0);
      local_1118 = local_17d8;
      uStack_1110 = uStack_17d0;
      local_1128 = local_17f8;
      uStack_1120 = uStack_17f0;
      local_17d8 = CONCAT44((int)local_ff8 + iStack_10e4 + (int)uStack_ff0 + iStack_1104,
                            (int)local_fd8 + local_10e8 + (int)uStack_fd0 + local_1108);
      uStack_17d0 = CONCAT44((int)local_1038 + local_ff8._4_4_ + (int)uStack_1030 + uStack_ff0._4_4_
                             ,(int)local_1018 + iStack_a0 + (int)uStack_1010 + iStack_c0);
      local_cc0 = local_1348;
      local_cd8 = local_17d8;
      uStack_cd0 = uStack_17d0;
      *(undefined8 *)local_1348 = local_17d8;
      *(undefined8 *)(local_1348 + 2) = uStack_17d0;
      local_1348 = local_1348 + 4;
      pMStack_10f0 = in_stack_ffffffffffffdd80;
      local_1038 = uVar1;
      uStack_1030 = uVar2;
      local_1018 = uVar3;
      uStack_1010 = uVar4;
      local_ff8 = uVar5;
      uStack_ff0 = uVar6;
      local_fd8 = uVar7;
      uStack_fd0 = uVar8;
      local_198 = in_stack_ffffffffffffdd80;
      local_188 = local_10f8;
      local_178 = uStack_10d0;
      local_168 = local_10d8;
      local_d8 = in_stack_ffffffffffffdd80;
    }
  }
  Mat::~Mat((Mat *)0x1dece1);
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            int64_t* tmpptr = tmp.channel(i / 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
        for (; i + 1 < size; i += 2)
        {
            const signed char* tmpptr = tmp.channel(i / 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));

                tmpptr += 16;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                tmpptr += 8;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}